

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.h
# Opt level: O3

int gladLoadGLLoader(GLADloadproc load)

{
  char *__s;
  bool bVar1;
  int iVar2;
  uint uVar3;
  GLubyte *pGVar4;
  size_t __n;
  uint uVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  int minor;
  int major;
  int local_38;
  int local_34;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
  uVar3 = 0;
  if ((glad_glGetString != (PFNGLGETSTRINGPROC)0x0) &&
     (pGVar4 = (*glad_glGetString)(0x1f02), pGVar4 != (GLubyte *)0x0)) {
    pGVar4 = (*glad_glGetString)(0x1f02);
    if (pGVar4 != (GLubyte *)0x0) {
      lVar7 = 0;
      do {
        __s = *(char **)((long)&PTR_anon_var_dwarf_1e906_001be490 + lVar7);
        __n = strlen(__s);
        iVar2 = strncmp((char *)pGVar4,__s,__n);
        if (iVar2 == 0) {
          pGVar4 = pGVar4 + __n;
          break;
        }
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x18);
      __isoc99_sscanf(pGVar4,"%d.%d",&local_34,&local_38);
      bVar1 = 3 < local_34;
      uVar3 = (uint)bVar1;
      uVar5 = (uint)(1 < local_34);
      GLAD_GL_VERSION_3_2 = uVar3;
      GLAD_GL_VERSION_1_2 = uVar5;
      if (1 < local_38) {
        GLAD_GL_VERSION_1_2 = 1;
        GLAD_GL_VERSION_3_2 = 1;
      }
      GLAD_GL_VERSION_2_1 = (int)(2 < local_34);
      uVar6 = (uint)(2 < local_34);
      if (local_34 != 3) {
        GLAD_GL_VERSION_3_2 = uVar3;
      }
      bVar8 = -1 < local_38;
      GLAD_GL_VERSION_1_0 = uVar5;
      if (bVar8) {
        GLAD_GL_VERSION_1_0 = 1;
      }
      GLAD_GL_VERSION_1_1 = uVar5;
      if (0 < local_38) {
        GLAD_GL_VERSION_1_1 = 1;
      }
      GLAD_GL_VERSION_2_0 = uVar6;
      if (bVar8) {
        GLAD_GL_VERSION_2_0 = 1;
      }
      if (0 < local_38) {
        GLAD_GL_VERSION_2_1 = 1;
      }
      GLAD_GL_VERSION_3_0 = uVar3;
      if (bVar8) {
        GLAD_GL_VERSION_3_0 = 1;
      }
      GLAD_GL_VERSION_3_1 = uVar3;
      if (0 < local_38) {
        GLAD_GL_VERSION_3_1 = 1;
      }
      bVar8 = local_34 == 3;
      if (!bVar8) {
        GLAD_GL_VERSION_3_1 = uVar3;
        GLAD_GL_VERSION_3_0 = uVar3;
      }
      if (local_34 != 2) {
        GLAD_GL_VERSION_2_1 = uVar6;
        GLAD_GL_VERSION_2_0 = uVar6;
      }
      GLAD_GL_VERSION_1_3 = uVar5;
      if (2 < local_38) {
        GLAD_GL_VERSION_1_3 = 1;
      }
      GLAD_GL_VERSION_1_4 = uVar5;
      if (3 < local_38) {
        GLAD_GL_VERSION_1_4 = 1;
      }
      GLAD_GL_VERSION_1_5 = uVar5;
      if (4 < local_38) {
        GLAD_GL_VERSION_1_5 = 1;
      }
      GLVersion.minor = local_38;
      GLVersion.major = local_34;
      if (local_34 != 1) {
        GLAD_GL_VERSION_1_1 = uVar5;
      }
      max_loaded_major = local_34;
      if (local_34 != 1) {
        GLAD_GL_VERSION_1_5 = uVar5;
        GLAD_GL_VERSION_1_3 = uVar5;
        GLAD_GL_VERSION_1_2 = uVar5;
        GLAD_GL_VERSION_1_0 = uVar5;
        GLAD_GL_VERSION_1_4 = uVar5;
      }
      GLAD_GL_VERSION_3_3 = 1;
      if (2 >= local_38 || !bVar8) {
        GLAD_GL_VERSION_3_3 = (uint)bVar1;
      }
      if (bVar1 || 2 < local_38 && bVar8) {
        max_loaded_major = 3;
      }
    }
    if (GLAD_GL_VERSION_1_0 != 0) {
      glad_glCullFace = (PFNGLCULLFACEPROC)(*load)("glCullFace");
      glad_glFrontFace = (PFNGLFRONTFACEPROC)(*load)("glFrontFace");
      glad_glHint = (PFNGLHINTPROC)(*load)("glHint");
      glad_glLineWidth = (PFNGLLINEWIDTHPROC)(*load)("glLineWidth");
      glad_glPointSize = (PFNGLPOINTSIZEPROC)(*load)("glPointSize");
      glad_glPolygonMode = (PFNGLPOLYGONMODEPROC)(*load)("glPolygonMode");
      glad_glScissor = (PFNGLSCISSORPROC)(*load)("glScissor");
      glad_glTexParameterf = (PFNGLTEXPARAMETERFPROC)(*load)("glTexParameterf");
      glad_glTexParameterfv = (PFNGLTEXPARAMETERFVPROC)(*load)("glTexParameterfv");
      glad_glTexParameteri = (PFNGLTEXPARAMETERIPROC)(*load)("glTexParameteri");
      glad_glTexParameteriv = (PFNGLTEXPARAMETERIVPROC)(*load)("glTexParameteriv");
      glad_glTexImage1D = (PFNGLTEXIMAGE1DPROC)(*load)("glTexImage1D");
      glad_glTexImage2D = (PFNGLTEXIMAGE2DPROC)(*load)("glTexImage2D");
      glad_glDrawBuffer = (PFNGLDRAWBUFFERPROC)(*load)("glDrawBuffer");
      glad_glClear = (PFNGLCLEARPROC)(*load)("glClear");
      glad_glClearColor = (PFNGLCLEARCOLORPROC)(*load)("glClearColor");
      glad_glClearStencil = (PFNGLCLEARSTENCILPROC)(*load)("glClearStencil");
      glad_glClearDepth = (PFNGLCLEARDEPTHPROC)(*load)("glClearDepth");
      glad_glStencilMask = (PFNGLSTENCILMASKPROC)(*load)("glStencilMask");
      glad_glColorMask = (PFNGLCOLORMASKPROC)(*load)("glColorMask");
      glad_glDepthMask = (PFNGLDEPTHMASKPROC)(*load)("glDepthMask");
      glad_glDisable = (PFNGLDISABLEPROC)(*load)("glDisable");
      glad_glEnable = (PFNGLENABLEPROC)(*load)("glEnable");
      glad_glFinish = (PFNGLFINISHPROC)(*load)("glFinish");
      glad_glFlush = (PFNGLFLUSHPROC)(*load)("glFlush");
      glad_glBlendFunc = (PFNGLBLENDFUNCPROC)(*load)("glBlendFunc");
      glad_glLogicOp = (PFNGLLOGICOPPROC)(*load)("glLogicOp");
      glad_glStencilFunc = (PFNGLSTENCILFUNCPROC)(*load)("glStencilFunc");
      glad_glStencilOp = (PFNGLSTENCILOPPROC)(*load)("glStencilOp");
      glad_glDepthFunc = (PFNGLDEPTHFUNCPROC)(*load)("glDepthFunc");
      glad_glPixelStoref = (PFNGLPIXELSTOREFPROC)(*load)("glPixelStoref");
      glad_glPixelStorei = (PFNGLPIXELSTOREIPROC)(*load)("glPixelStorei");
      glad_glReadBuffer = (PFNGLREADBUFFERPROC)(*load)("glReadBuffer");
      glad_glReadPixels = (PFNGLREADPIXELSPROC)(*load)("glReadPixels");
      glad_glGetBooleanv = (PFNGLGETBOOLEANVPROC)(*load)("glGetBooleanv");
      glad_glGetDoublev = (PFNGLGETDOUBLEVPROC)(*load)("glGetDoublev");
      glad_glGetError = (PFNGLGETERRORPROC)(*load)("glGetError");
      glad_glGetFloatv = (PFNGLGETFLOATVPROC)(*load)("glGetFloatv");
      glad_glGetIntegerv = (PFNGLGETINTEGERVPROC)(*load)("glGetIntegerv");
      glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
      glad_glGetTexImage = (PFNGLGETTEXIMAGEPROC)(*load)("glGetTexImage");
      glad_glGetTexParameterfv = (PFNGLGETTEXPARAMETERFVPROC)(*load)("glGetTexParameterfv");
      glad_glGetTexParameteriv = (PFNGLGETTEXPARAMETERIVPROC)(*load)("glGetTexParameteriv");
      glad_glGetTexLevelParameterfv =
           (PFNGLGETTEXLEVELPARAMETERFVPROC)(*load)("glGetTexLevelParameterfv");
      glad_glGetTexLevelParameteriv =
           (PFNGLGETTEXLEVELPARAMETERIVPROC)(*load)("glGetTexLevelParameteriv");
      glad_glIsEnabled = (PFNGLISENABLEDPROC)(*load)("glIsEnabled");
      glad_glDepthRange = (PFNGLDEPTHRANGEPROC)(*load)("glDepthRange");
      glad_glViewport = (PFNGLVIEWPORTPROC)(*load)("glViewport");
    }
    if (GLAD_GL_VERSION_1_1 != 0) {
      glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)(*load)("glDrawArrays");
      glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)(*load)("glDrawElements");
      glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)(*load)("glPolygonOffset");
      glad_glCopyTexImage1D = (PFNGLCOPYTEXIMAGE1DPROC)(*load)("glCopyTexImage1D");
      glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)(*load)("glCopyTexImage2D");
      glad_glCopyTexSubImage1D = (PFNGLCOPYTEXSUBIMAGE1DPROC)(*load)("glCopyTexSubImage1D");
      glad_glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC)(*load)("glCopyTexSubImage2D");
      glad_glTexSubImage1D = (PFNGLTEXSUBIMAGE1DPROC)(*load)("glTexSubImage1D");
      glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)(*load)("glTexSubImage2D");
      glad_glBindTexture = (PFNGLBINDTEXTUREPROC)(*load)("glBindTexture");
      glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)(*load)("glDeleteTextures");
      glad_glGenTextures = (PFNGLGENTEXTURESPROC)(*load)("glGenTextures");
      glad_glIsTexture = (PFNGLISTEXTUREPROC)(*load)("glIsTexture");
    }
    if (GLAD_GL_VERSION_1_2 != 0) {
      glad_glDrawRangeElements = (PFNGLDRAWRANGEELEMENTSPROC)(*load)("glDrawRangeElements");
      glad_glTexImage3D = (PFNGLTEXIMAGE3DPROC)(*load)("glTexImage3D");
      glad_glTexSubImage3D = (PFNGLTEXSUBIMAGE3DPROC)(*load)("glTexSubImage3D");
      glad_glCopyTexSubImage3D = (PFNGLCOPYTEXSUBIMAGE3DPROC)(*load)("glCopyTexSubImage3D");
    }
    if (GLAD_GL_VERSION_1_3 != 0) {
      glad_glActiveTexture = (PFNGLACTIVETEXTUREPROC)(*load)("glActiveTexture");
      glad_glSampleCoverage = (PFNGLSAMPLECOVERAGEPROC)(*load)("glSampleCoverage");
      glad_glCompressedTexImage3D = (PFNGLCOMPRESSEDTEXIMAGE3DPROC)(*load)("glCompressedTexImage3D")
      ;
      glad_glCompressedTexImage2D = (PFNGLCOMPRESSEDTEXIMAGE2DPROC)(*load)("glCompressedTexImage2D")
      ;
      glad_glCompressedTexImage1D = (PFNGLCOMPRESSEDTEXIMAGE1DPROC)(*load)("glCompressedTexImage1D")
      ;
      glad_glCompressedTexSubImage3D =
           (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC)(*load)("glCompressedTexSubImage3D");
      glad_glCompressedTexSubImage2D =
           (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)(*load)("glCompressedTexSubImage2D");
      glad_glCompressedTexSubImage1D =
           (PFNGLCOMPRESSEDTEXSUBIMAGE1DPROC)(*load)("glCompressedTexSubImage1D");
      glad_glGetCompressedTexImage =
           (PFNGLGETCOMPRESSEDTEXIMAGEPROC)(*load)("glGetCompressedTexImage");
    }
    if (GLAD_GL_VERSION_1_4 != 0) {
      glad_glBlendFuncSeparate = (PFNGLBLENDFUNCSEPARATEPROC)(*load)("glBlendFuncSeparate");
      glad_glMultiDrawArrays = (PFNGLMULTIDRAWARRAYSPROC)(*load)("glMultiDrawArrays");
      glad_glMultiDrawElements = (PFNGLMULTIDRAWELEMENTSPROC)(*load)("glMultiDrawElements");
      glad_glPointParameterf = (PFNGLPOINTPARAMETERFPROC)(*load)("glPointParameterf");
      glad_glPointParameterfv = (PFNGLPOINTPARAMETERFVPROC)(*load)("glPointParameterfv");
      glad_glPointParameteri = (PFNGLPOINTPARAMETERIPROC)(*load)("glPointParameteri");
      glad_glPointParameteriv = (PFNGLPOINTPARAMETERIVPROC)(*load)("glPointParameteriv");
      glad_glBlendColor = (PFNGLBLENDCOLORPROC)(*load)("glBlendColor");
      glad_glBlendEquation = (PFNGLBLENDEQUATIONPROC)(*load)("glBlendEquation");
    }
    if (GLAD_GL_VERSION_1_5 != 0) {
      glad_glGenQueries = (PFNGLGENQUERIESPROC)(*load)("glGenQueries");
      glad_glDeleteQueries = (PFNGLDELETEQUERIESPROC)(*load)("glDeleteQueries");
      glad_glIsQuery = (PFNGLISQUERYPROC)(*load)("glIsQuery");
      glad_glBeginQuery = (PFNGLBEGINQUERYPROC)(*load)("glBeginQuery");
      glad_glEndQuery = (PFNGLENDQUERYPROC)(*load)("glEndQuery");
      glad_glGetQueryiv = (PFNGLGETQUERYIVPROC)(*load)("glGetQueryiv");
      glad_glGetQueryObjectiv = (PFNGLGETQUERYOBJECTIVPROC)(*load)("glGetQueryObjectiv");
      glad_glGetQueryObjectuiv = (PFNGLGETQUERYOBJECTUIVPROC)(*load)("glGetQueryObjectuiv");
      glad_glBindBuffer = (PFNGLBINDBUFFERPROC)(*load)("glBindBuffer");
      glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)(*load)("glDeleteBuffers");
      glad_glGenBuffers = (PFNGLGENBUFFERSPROC)(*load)("glGenBuffers");
      glad_glIsBuffer = (PFNGLISBUFFERPROC)(*load)("glIsBuffer");
      glad_glBufferData = (PFNGLBUFFERDATAPROC)(*load)("glBufferData");
      glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)(*load)("glBufferSubData");
      glad_glGetBufferSubData = (PFNGLGETBUFFERSUBDATAPROC)(*load)("glGetBufferSubData");
      glad_glMapBuffer = (PFNGLMAPBUFFERPROC)(*load)("glMapBuffer");
      glad_glUnmapBuffer = (PFNGLUNMAPBUFFERPROC)(*load)("glUnmapBuffer");
      glad_glGetBufferParameteriv = (PFNGLGETBUFFERPARAMETERIVPROC)(*load)("glGetBufferParameteriv")
      ;
      glad_glGetBufferPointerv = (PFNGLGETBUFFERPOINTERVPROC)(*load)("glGetBufferPointerv");
    }
    if (GLAD_GL_VERSION_2_0 != 0) {
      glad_glBlendEquationSeparate =
           (PFNGLBLENDEQUATIONSEPARATEPROC)(*load)("glBlendEquationSeparate");
      glad_glDrawBuffers = (PFNGLDRAWBUFFERSPROC)(*load)("glDrawBuffers");
      glad_glStencilOpSeparate = (PFNGLSTENCILOPSEPARATEPROC)(*load)("glStencilOpSeparate");
      glad_glStencilFuncSeparate = (PFNGLSTENCILFUNCSEPARATEPROC)(*load)("glStencilFuncSeparate");
      glad_glStencilMaskSeparate = (PFNGLSTENCILMASKSEPARATEPROC)(*load)("glStencilMaskSeparate");
      glad_glAttachShader = (PFNGLATTACHSHADERPROC)(*load)("glAttachShader");
      glad_glBindAttribLocation = (PFNGLBINDATTRIBLOCATIONPROC)(*load)("glBindAttribLocation");
      glad_glCompileShader = (PFNGLCOMPILESHADERPROC)(*load)("glCompileShader");
      glad_glCreateProgram = (PFNGLCREATEPROGRAMPROC)(*load)("glCreateProgram");
      glad_glCreateShader = (PFNGLCREATESHADERPROC)(*load)("glCreateShader");
      glad_glDeleteProgram = (PFNGLDELETEPROGRAMPROC)(*load)("glDeleteProgram");
      glad_glDeleteShader = (PFNGLDELETESHADERPROC)(*load)("glDeleteShader");
      glad_glDetachShader = (PFNGLDETACHSHADERPROC)(*load)("glDetachShader");
      glad_glDisableVertexAttribArray =
           (PFNGLDISABLEVERTEXATTRIBARRAYPROC)(*load)("glDisableVertexAttribArray");
      glad_glEnableVertexAttribArray =
           (PFNGLENABLEVERTEXATTRIBARRAYPROC)(*load)("glEnableVertexAttribArray");
      glad_glGetActiveAttrib = (PFNGLGETACTIVEATTRIBPROC)(*load)("glGetActiveAttrib");
      glad_glGetActiveUniform = (PFNGLGETACTIVEUNIFORMPROC)(*load)("glGetActiveUniform");
      glad_glGetAttachedShaders = (PFNGLGETATTACHEDSHADERSPROC)(*load)("glGetAttachedShaders");
      glad_glGetAttribLocation = (PFNGLGETATTRIBLOCATIONPROC)(*load)("glGetAttribLocation");
      glad_glGetProgramiv = (PFNGLGETPROGRAMIVPROC)(*load)("glGetProgramiv");
      glad_glGetProgramInfoLog = (PFNGLGETPROGRAMINFOLOGPROC)(*load)("glGetProgramInfoLog");
      glad_glGetShaderiv = (PFNGLGETSHADERIVPROC)(*load)("glGetShaderiv");
      glad_glGetShaderInfoLog = (PFNGLGETSHADERINFOLOGPROC)(*load)("glGetShaderInfoLog");
      glad_glGetShaderSource = (PFNGLGETSHADERSOURCEPROC)(*load)("glGetShaderSource");
      glad_glGetUniformLocation = (PFNGLGETUNIFORMLOCATIONPROC)(*load)("glGetUniformLocation");
      glad_glGetUniformfv = (PFNGLGETUNIFORMFVPROC)(*load)("glGetUniformfv");
      glad_glGetUniformiv = (PFNGLGETUNIFORMIVPROC)(*load)("glGetUniformiv");
      glad_glGetVertexAttribdv = (PFNGLGETVERTEXATTRIBDVPROC)(*load)("glGetVertexAttribdv");
      glad_glGetVertexAttribfv = (PFNGLGETVERTEXATTRIBFVPROC)(*load)("glGetVertexAttribfv");
      glad_glGetVertexAttribiv = (PFNGLGETVERTEXATTRIBIVPROC)(*load)("glGetVertexAttribiv");
      glad_glGetVertexAttribPointerv =
           (PFNGLGETVERTEXATTRIBPOINTERVPROC)(*load)("glGetVertexAttribPointerv");
      glad_glIsProgram = (PFNGLISPROGRAMPROC)(*load)("glIsProgram");
      glad_glIsShader = (PFNGLISSHADERPROC)(*load)("glIsShader");
      glad_glLinkProgram = (PFNGLLINKPROGRAMPROC)(*load)("glLinkProgram");
      glad_glShaderSource = (PFNGLSHADERSOURCEPROC)(*load)("glShaderSource");
      glad_glUseProgram = (PFNGLUSEPROGRAMPROC)(*load)("glUseProgram");
      glad_glUniform1f = (PFNGLUNIFORM1FPROC)(*load)("glUniform1f");
      glad_glUniform2f = (PFNGLUNIFORM2FPROC)(*load)("glUniform2f");
      glad_glUniform3f = (PFNGLUNIFORM3FPROC)(*load)("glUniform3f");
      glad_glUniform4f = (PFNGLUNIFORM4FPROC)(*load)("glUniform4f");
      glad_glUniform1i = (PFNGLUNIFORM1IPROC)(*load)("glUniform1i");
      glad_glUniform2i = (PFNGLUNIFORM2IPROC)(*load)("glUniform2i");
      glad_glUniform3i = (PFNGLUNIFORM3IPROC)(*load)("glUniform3i");
      glad_glUniform4i = (PFNGLUNIFORM4IPROC)(*load)("glUniform4i");
      glad_glUniform1fv = (PFNGLUNIFORM1FVPROC)(*load)("glUniform1fv");
      glad_glUniform2fv = (PFNGLUNIFORM2FVPROC)(*load)("glUniform2fv");
      glad_glUniform3fv = (PFNGLUNIFORM3FVPROC)(*load)("glUniform3fv");
      glad_glUniform4fv = (PFNGLUNIFORM4FVPROC)(*load)("glUniform4fv");
      glad_glUniform1iv = (PFNGLUNIFORM1IVPROC)(*load)("glUniform1iv");
      glad_glUniform2iv = (PFNGLUNIFORM2IVPROC)(*load)("glUniform2iv");
      glad_glUniform3iv = (PFNGLUNIFORM3IVPROC)(*load)("glUniform3iv");
      glad_glUniform4iv = (PFNGLUNIFORM4IVPROC)(*load)("glUniform4iv");
      glad_glUniformMatrix2fv = (PFNGLUNIFORMMATRIX2FVPROC)(*load)("glUniformMatrix2fv");
      glad_glUniformMatrix3fv = (PFNGLUNIFORMMATRIX3FVPROC)(*load)("glUniformMatrix3fv");
      glad_glUniformMatrix4fv = (PFNGLUNIFORMMATRIX4FVPROC)(*load)("glUniformMatrix4fv");
      glad_glValidateProgram = (PFNGLVALIDATEPROGRAMPROC)(*load)("glValidateProgram");
      glad_glVertexAttrib1d = (PFNGLVERTEXATTRIB1DPROC)(*load)("glVertexAttrib1d");
      glad_glVertexAttrib1dv = (PFNGLVERTEXATTRIB1DVPROC)(*load)("glVertexAttrib1dv");
      glad_glVertexAttrib1f = (PFNGLVERTEXATTRIB1FPROC)(*load)("glVertexAttrib1f");
      glad_glVertexAttrib1fv = (PFNGLVERTEXATTRIB1FVPROC)(*load)("glVertexAttrib1fv");
      glad_glVertexAttrib1s = (PFNGLVERTEXATTRIB1SPROC)(*load)("glVertexAttrib1s");
      glad_glVertexAttrib1sv = (PFNGLVERTEXATTRIB1SVPROC)(*load)("glVertexAttrib1sv");
      glad_glVertexAttrib2d = (PFNGLVERTEXATTRIB2DPROC)(*load)("glVertexAttrib2d");
      glad_glVertexAttrib2dv = (PFNGLVERTEXATTRIB2DVPROC)(*load)("glVertexAttrib2dv");
      glad_glVertexAttrib2f = (PFNGLVERTEXATTRIB2FPROC)(*load)("glVertexAttrib2f");
      glad_glVertexAttrib2fv = (PFNGLVERTEXATTRIB2FVPROC)(*load)("glVertexAttrib2fv");
      glad_glVertexAttrib2s = (PFNGLVERTEXATTRIB2SPROC)(*load)("glVertexAttrib2s");
      glad_glVertexAttrib2sv = (PFNGLVERTEXATTRIB2SVPROC)(*load)("glVertexAttrib2sv");
      glad_glVertexAttrib3d = (PFNGLVERTEXATTRIB3DPROC)(*load)("glVertexAttrib3d");
      glad_glVertexAttrib3dv = (PFNGLVERTEXATTRIB3DVPROC)(*load)("glVertexAttrib3dv");
      glad_glVertexAttrib3f = (PFNGLVERTEXATTRIB3FPROC)(*load)("glVertexAttrib3f");
      glad_glVertexAttrib3fv = (PFNGLVERTEXATTRIB3FVPROC)(*load)("glVertexAttrib3fv");
      glad_glVertexAttrib3s = (PFNGLVERTEXATTRIB3SPROC)(*load)("glVertexAttrib3s");
      glad_glVertexAttrib3sv = (PFNGLVERTEXATTRIB3SVPROC)(*load)("glVertexAttrib3sv");
      glad_glVertexAttrib4Nbv = (PFNGLVERTEXATTRIB4NBVPROC)(*load)("glVertexAttrib4Nbv");
      glad_glVertexAttrib4Niv = (PFNGLVERTEXATTRIB4NIVPROC)(*load)("glVertexAttrib4Niv");
      glad_glVertexAttrib4Nsv = (PFNGLVERTEXATTRIB4NSVPROC)(*load)("glVertexAttrib4Nsv");
      glad_glVertexAttrib4Nub = (PFNGLVERTEXATTRIB4NUBPROC)(*load)("glVertexAttrib4Nub");
      glad_glVertexAttrib4Nubv = (PFNGLVERTEXATTRIB4NUBVPROC)(*load)("glVertexAttrib4Nubv");
      glad_glVertexAttrib4Nuiv = (PFNGLVERTEXATTRIB4NUIVPROC)(*load)("glVertexAttrib4Nuiv");
      glad_glVertexAttrib4Nusv = (PFNGLVERTEXATTRIB4NUSVPROC)(*load)("glVertexAttrib4Nusv");
      glad_glVertexAttrib4bv = (PFNGLVERTEXATTRIB4BVPROC)(*load)("glVertexAttrib4bv");
      glad_glVertexAttrib4d = (PFNGLVERTEXATTRIB4DPROC)(*load)("glVertexAttrib4d");
      glad_glVertexAttrib4dv = (PFNGLVERTEXATTRIB4DVPROC)(*load)("glVertexAttrib4dv");
      glad_glVertexAttrib4f = (PFNGLVERTEXATTRIB4FPROC)(*load)("glVertexAttrib4f");
      glad_glVertexAttrib4fv = (PFNGLVERTEXATTRIB4FVPROC)(*load)("glVertexAttrib4fv");
      glad_glVertexAttrib4iv = (PFNGLVERTEXATTRIB4IVPROC)(*load)("glVertexAttrib4iv");
      glad_glVertexAttrib4s = (PFNGLVERTEXATTRIB4SPROC)(*load)("glVertexAttrib4s");
      glad_glVertexAttrib4sv = (PFNGLVERTEXATTRIB4SVPROC)(*load)("glVertexAttrib4sv");
      glad_glVertexAttrib4ubv = (PFNGLVERTEXATTRIB4UBVPROC)(*load)("glVertexAttrib4ubv");
      glad_glVertexAttrib4uiv = (PFNGLVERTEXATTRIB4UIVPROC)(*load)("glVertexAttrib4uiv");
      glad_glVertexAttrib4usv = (PFNGLVERTEXATTRIB4USVPROC)(*load)("glVertexAttrib4usv");
      glad_glVertexAttribPointer = (PFNGLVERTEXATTRIBPOINTERPROC)(*load)("glVertexAttribPointer");
    }
    if (GLAD_GL_VERSION_2_1 != 0) {
      glad_glUniformMatrix2x3fv = (PFNGLUNIFORMMATRIX2X3FVPROC)(*load)("glUniformMatrix2x3fv");
      glad_glUniformMatrix3x2fv = (PFNGLUNIFORMMATRIX3X2FVPROC)(*load)("glUniformMatrix3x2fv");
      glad_glUniformMatrix2x4fv = (PFNGLUNIFORMMATRIX2X4FVPROC)(*load)("glUniformMatrix2x4fv");
      glad_glUniformMatrix4x2fv = (PFNGLUNIFORMMATRIX4X2FVPROC)(*load)("glUniformMatrix4x2fv");
      glad_glUniformMatrix3x4fv = (PFNGLUNIFORMMATRIX3X4FVPROC)(*load)("glUniformMatrix3x4fv");
      glad_glUniformMatrix4x3fv = (PFNGLUNIFORMMATRIX4X3FVPROC)(*load)("glUniformMatrix4x3fv");
    }
    if (GLAD_GL_VERSION_3_0 != 0) {
      glad_glColorMaski = (PFNGLCOLORMASKIPROC)(*load)("glColorMaski");
      glad_glGetBooleani_v = (PFNGLGETBOOLEANI_VPROC)(*load)("glGetBooleani_v");
      glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*load)("glGetIntegeri_v");
      glad_glEnablei = (PFNGLENABLEIPROC)(*load)("glEnablei");
      glad_glDisablei = (PFNGLDISABLEIPROC)(*load)("glDisablei");
      glad_glIsEnabledi = (PFNGLISENABLEDIPROC)(*load)("glIsEnabledi");
      glad_glBeginTransformFeedback =
           (PFNGLBEGINTRANSFORMFEEDBACKPROC)(*load)("glBeginTransformFeedback");
      glad_glEndTransformFeedback = (PFNGLENDTRANSFORMFEEDBACKPROC)(*load)("glEndTransformFeedback")
      ;
      glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)("glBindBufferRange");
      glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)("glBindBufferBase");
      glad_glTransformFeedbackVaryings =
           (PFNGLTRANSFORMFEEDBACKVARYINGSPROC)(*load)("glTransformFeedbackVaryings");
      glad_glGetTransformFeedbackVarying =
           (PFNGLGETTRANSFORMFEEDBACKVARYINGPROC)(*load)("glGetTransformFeedbackVarying");
      glad_glClampColor = (PFNGLCLAMPCOLORPROC)(*load)("glClampColor");
      glad_glBeginConditionalRender =
           (PFNGLBEGINCONDITIONALRENDERPROC)(*load)("glBeginConditionalRender");
      glad_glEndConditionalRender = (PFNGLENDCONDITIONALRENDERPROC)(*load)("glEndConditionalRender")
      ;
      glad_glVertexAttribIPointer = (PFNGLVERTEXATTRIBIPOINTERPROC)(*load)("glVertexAttribIPointer")
      ;
      glad_glGetVertexAttribIiv = (PFNGLGETVERTEXATTRIBIIVPROC)(*load)("glGetVertexAttribIiv");
      glad_glGetVertexAttribIuiv = (PFNGLGETVERTEXATTRIBIUIVPROC)(*load)("glGetVertexAttribIuiv");
      glad_glVertexAttribI1i = (PFNGLVERTEXATTRIBI1IPROC)(*load)("glVertexAttribI1i");
      glad_glVertexAttribI2i = (PFNGLVERTEXATTRIBI2IPROC)(*load)("glVertexAttribI2i");
      glad_glVertexAttribI3i = (PFNGLVERTEXATTRIBI3IPROC)(*load)("glVertexAttribI3i");
      glad_glVertexAttribI4i = (PFNGLVERTEXATTRIBI4IPROC)(*load)("glVertexAttribI4i");
      glad_glVertexAttribI1ui = (PFNGLVERTEXATTRIBI1UIPROC)(*load)("glVertexAttribI1ui");
      glad_glVertexAttribI2ui = (PFNGLVERTEXATTRIBI2UIPROC)(*load)("glVertexAttribI2ui");
      glad_glVertexAttribI3ui = (PFNGLVERTEXATTRIBI3UIPROC)(*load)("glVertexAttribI3ui");
      glad_glVertexAttribI4ui = (PFNGLVERTEXATTRIBI4UIPROC)(*load)("glVertexAttribI4ui");
      glad_glVertexAttribI1iv = (PFNGLVERTEXATTRIBI1IVPROC)(*load)("glVertexAttribI1iv");
      glad_glVertexAttribI2iv = (PFNGLVERTEXATTRIBI2IVPROC)(*load)("glVertexAttribI2iv");
      glad_glVertexAttribI3iv = (PFNGLVERTEXATTRIBI3IVPROC)(*load)("glVertexAttribI3iv");
      glad_glVertexAttribI4iv = (PFNGLVERTEXATTRIBI4IVPROC)(*load)("glVertexAttribI4iv");
      glad_glVertexAttribI1uiv = (PFNGLVERTEXATTRIBI1UIVPROC)(*load)("glVertexAttribI1uiv");
      glad_glVertexAttribI2uiv = (PFNGLVERTEXATTRIBI2UIVPROC)(*load)("glVertexAttribI2uiv");
      glad_glVertexAttribI3uiv = (PFNGLVERTEXATTRIBI3UIVPROC)(*load)("glVertexAttribI3uiv");
      glad_glVertexAttribI4uiv = (PFNGLVERTEXATTRIBI4UIVPROC)(*load)("glVertexAttribI4uiv");
      glad_glVertexAttribI4bv = (PFNGLVERTEXATTRIBI4BVPROC)(*load)("glVertexAttribI4bv");
      glad_glVertexAttribI4sv = (PFNGLVERTEXATTRIBI4SVPROC)(*load)("glVertexAttribI4sv");
      glad_glVertexAttribI4ubv = (PFNGLVERTEXATTRIBI4UBVPROC)(*load)("glVertexAttribI4ubv");
      glad_glVertexAttribI4usv = (PFNGLVERTEXATTRIBI4USVPROC)(*load)("glVertexAttribI4usv");
      glad_glGetUniformuiv = (PFNGLGETUNIFORMUIVPROC)(*load)("glGetUniformuiv");
      glad_glBindFragDataLocation = (PFNGLBINDFRAGDATALOCATIONPROC)(*load)("glBindFragDataLocation")
      ;
      glad_glGetFragDataLocation = (PFNGLGETFRAGDATALOCATIONPROC)(*load)("glGetFragDataLocation");
      glad_glUniform1ui = (PFNGLUNIFORM1UIPROC)(*load)("glUniform1ui");
      glad_glUniform2ui = (PFNGLUNIFORM2UIPROC)(*load)("glUniform2ui");
      glad_glUniform3ui = (PFNGLUNIFORM3UIPROC)(*load)("glUniform3ui");
      glad_glUniform4ui = (PFNGLUNIFORM4UIPROC)(*load)("glUniform4ui");
      glad_glUniform1uiv = (PFNGLUNIFORM1UIVPROC)(*load)("glUniform1uiv");
      glad_glUniform2uiv = (PFNGLUNIFORM2UIVPROC)(*load)("glUniform2uiv");
      glad_glUniform3uiv = (PFNGLUNIFORM3UIVPROC)(*load)("glUniform3uiv");
      glad_glUniform4uiv = (PFNGLUNIFORM4UIVPROC)(*load)("glUniform4uiv");
      glad_glTexParameterIiv = (PFNGLTEXPARAMETERIIVPROC)(*load)("glTexParameterIiv");
      glad_glTexParameterIuiv = (PFNGLTEXPARAMETERIUIVPROC)(*load)("glTexParameterIuiv");
      glad_glGetTexParameterIiv = (PFNGLGETTEXPARAMETERIIVPROC)(*load)("glGetTexParameterIiv");
      glad_glGetTexParameterIuiv = (PFNGLGETTEXPARAMETERIUIVPROC)(*load)("glGetTexParameterIuiv");
      glad_glClearBufferiv = (PFNGLCLEARBUFFERIVPROC)(*load)("glClearBufferiv");
      glad_glClearBufferuiv = (PFNGLCLEARBUFFERUIVPROC)(*load)("glClearBufferuiv");
      glad_glClearBufferfv = (PFNGLCLEARBUFFERFVPROC)(*load)("glClearBufferfv");
      glad_glClearBufferfi = (PFNGLCLEARBUFFERFIPROC)(*load)("glClearBufferfi");
      glad_glGetStringi = (PFNGLGETSTRINGIPROC)(*load)("glGetStringi");
      glad_glIsRenderbuffer = (PFNGLISRENDERBUFFERPROC)(*load)("glIsRenderbuffer");
      glad_glBindRenderbuffer = (PFNGLBINDRENDERBUFFERPROC)(*load)("glBindRenderbuffer");
      glad_glDeleteRenderbuffers = (PFNGLDELETERENDERBUFFERSPROC)(*load)("glDeleteRenderbuffers");
      glad_glGenRenderbuffers = (PFNGLGENRENDERBUFFERSPROC)(*load)("glGenRenderbuffers");
      glad_glRenderbufferStorage = (PFNGLRENDERBUFFERSTORAGEPROC)(*load)("glRenderbufferStorage");
      glad_glGetRenderbufferParameteriv =
           (PFNGLGETRENDERBUFFERPARAMETERIVPROC)(*load)("glGetRenderbufferParameteriv");
      glad_glIsFramebuffer = (PFNGLISFRAMEBUFFERPROC)(*load)("glIsFramebuffer");
      glad_glBindFramebuffer = (PFNGLBINDFRAMEBUFFERPROC)(*load)("glBindFramebuffer");
      glad_glDeleteFramebuffers = (PFNGLDELETEFRAMEBUFFERSPROC)(*load)("glDeleteFramebuffers");
      glad_glGenFramebuffers = (PFNGLGENFRAMEBUFFERSPROC)(*load)("glGenFramebuffers");
      glad_glCheckFramebufferStatus =
           (PFNGLCHECKFRAMEBUFFERSTATUSPROC)(*load)("glCheckFramebufferStatus");
      glad_glFramebufferTexture1D = (PFNGLFRAMEBUFFERTEXTURE1DPROC)(*load)("glFramebufferTexture1D")
      ;
      glad_glFramebufferTexture2D = (PFNGLFRAMEBUFFERTEXTURE2DPROC)(*load)("glFramebufferTexture2D")
      ;
      glad_glFramebufferTexture3D = (PFNGLFRAMEBUFFERTEXTURE3DPROC)(*load)("glFramebufferTexture3D")
      ;
      glad_glFramebufferRenderbuffer =
           (PFNGLFRAMEBUFFERRENDERBUFFERPROC)(*load)("glFramebufferRenderbuffer");
      glad_glGetFramebufferAttachmentParameteriv =
           (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVPROC)
           (*load)("glGetFramebufferAttachmentParameteriv");
      glad_glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)(*load)("glGenerateMipmap");
      glad_glBlitFramebuffer = (PFNGLBLITFRAMEBUFFERPROC)(*load)("glBlitFramebuffer");
      glad_glRenderbufferStorageMultisample =
           (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEPROC)(*load)("glRenderbufferStorageMultisample");
      glad_glFramebufferTextureLayer =
           (PFNGLFRAMEBUFFERTEXTURELAYERPROC)(*load)("glFramebufferTextureLayer");
      glad_glMapBufferRange = (PFNGLMAPBUFFERRANGEPROC)(*load)("glMapBufferRange");
      glad_glFlushMappedBufferRange =
           (PFNGLFLUSHMAPPEDBUFFERRANGEPROC)(*load)("glFlushMappedBufferRange");
      glad_glBindVertexArray = (PFNGLBINDVERTEXARRAYPROC)(*load)("glBindVertexArray");
      glad_glDeleteVertexArrays = (PFNGLDELETEVERTEXARRAYSPROC)(*load)("glDeleteVertexArrays");
      glad_glGenVertexArrays = (PFNGLGENVERTEXARRAYSPROC)(*load)("glGenVertexArrays");
      glad_glIsVertexArray = (PFNGLISVERTEXARRAYPROC)(*load)("glIsVertexArray");
    }
    if (GLAD_GL_VERSION_3_1 != 0) {
      glad_glDrawArraysInstanced = (PFNGLDRAWARRAYSINSTANCEDPROC)(*load)("glDrawArraysInstanced");
      glad_glDrawElementsInstanced =
           (PFNGLDRAWELEMENTSINSTANCEDPROC)(*load)("glDrawElementsInstanced");
      glad_glTexBuffer = (PFNGLTEXBUFFERPROC)(*load)("glTexBuffer");
      glad_glPrimitiveRestartIndex =
           (PFNGLPRIMITIVERESTARTINDEXPROC)(*load)("glPrimitiveRestartIndex");
      glad_glCopyBufferSubData = (PFNGLCOPYBUFFERSUBDATAPROC)(*load)("glCopyBufferSubData");
      glad_glGetUniformIndices = (PFNGLGETUNIFORMINDICESPROC)(*load)("glGetUniformIndices");
      glad_glGetActiveUniformsiv = (PFNGLGETACTIVEUNIFORMSIVPROC)(*load)("glGetActiveUniformsiv");
      glad_glGetActiveUniformName = (PFNGLGETACTIVEUNIFORMNAMEPROC)(*load)("glGetActiveUniformName")
      ;
      glad_glGetUniformBlockIndex = (PFNGLGETUNIFORMBLOCKINDEXPROC)(*load)("glGetUniformBlockIndex")
      ;
      glad_glGetActiveUniformBlockiv =
           (PFNGLGETACTIVEUNIFORMBLOCKIVPROC)(*load)("glGetActiveUniformBlockiv");
      glad_glGetActiveUniformBlockName =
           (PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC)(*load)("glGetActiveUniformBlockName");
      glad_glUniformBlockBinding = (PFNGLUNIFORMBLOCKBINDINGPROC)(*load)("glUniformBlockBinding");
      glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)("glBindBufferRange");
      glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)("glBindBufferBase");
      glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*load)("glGetIntegeri_v");
    }
    if (GLAD_GL_VERSION_3_2 != 0) {
      glad_glDrawElementsBaseVertex =
           (PFNGLDRAWELEMENTSBASEVERTEXPROC)(*load)("glDrawElementsBaseVertex");
      glad_glDrawRangeElementsBaseVertex =
           (PFNGLDRAWRANGEELEMENTSBASEVERTEXPROC)(*load)("glDrawRangeElementsBaseVertex");
      glad_glDrawElementsInstancedBaseVertex =
           (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXPROC)(*load)("glDrawElementsInstancedBaseVertex");
      glad_glMultiDrawElementsBaseVertex =
           (PFNGLMULTIDRAWELEMENTSBASEVERTEXPROC)(*load)("glMultiDrawElementsBaseVertex");
      glad_glProvokingVertex = (PFNGLPROVOKINGVERTEXPROC)(*load)("glProvokingVertex");
      glad_glFenceSync = (PFNGLFENCESYNCPROC)(*load)("glFenceSync");
      glad_glIsSync = (PFNGLISSYNCPROC)(*load)("glIsSync");
      glad_glDeleteSync = (PFNGLDELETESYNCPROC)(*load)("glDeleteSync");
      glad_glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)(*load)("glClientWaitSync");
      glad_glWaitSync = (PFNGLWAITSYNCPROC)(*load)("glWaitSync");
      glad_glGetInteger64v = (PFNGLGETINTEGER64VPROC)(*load)("glGetInteger64v");
      glad_glGetSynciv = (PFNGLGETSYNCIVPROC)(*load)("glGetSynciv");
      glad_glGetInteger64i_v = (PFNGLGETINTEGER64I_VPROC)(*load)("glGetInteger64i_v");
      glad_glGetBufferParameteri64v =
           (PFNGLGETBUFFERPARAMETERI64VPROC)(*load)("glGetBufferParameteri64v");
      glad_glFramebufferTexture = (PFNGLFRAMEBUFFERTEXTUREPROC)(*load)("glFramebufferTexture");
      glad_glTexImage2DMultisample =
           (PFNGLTEXIMAGE2DMULTISAMPLEPROC)(*load)("glTexImage2DMultisample");
      glad_glTexImage3DMultisample =
           (PFNGLTEXIMAGE3DMULTISAMPLEPROC)(*load)("glTexImage3DMultisample");
      glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC)(*load)("glGetMultisamplefv");
      glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)(*load)("glSampleMaski");
    }
    if (GLAD_GL_VERSION_3_3 != 0) {
      glad_glBindFragDataLocationIndexed =
           (PFNGLBINDFRAGDATALOCATIONINDEXEDPROC)(*load)("glBindFragDataLocationIndexed");
      glad_glGetFragDataIndex = (PFNGLGETFRAGDATAINDEXPROC)(*load)("glGetFragDataIndex");
      glad_glGenSamplers = (PFNGLGENSAMPLERSPROC)(*load)("glGenSamplers");
      glad_glDeleteSamplers = (PFNGLDELETESAMPLERSPROC)(*load)("glDeleteSamplers");
      glad_glIsSampler = (PFNGLISSAMPLERPROC)(*load)("glIsSampler");
      glad_glBindSampler = (PFNGLBINDSAMPLERPROC)(*load)("glBindSampler");
      glad_glSamplerParameteri = (PFNGLSAMPLERPARAMETERIPROC)(*load)("glSamplerParameteri");
      glad_glSamplerParameteriv = (PFNGLSAMPLERPARAMETERIVPROC)(*load)("glSamplerParameteriv");
      glad_glSamplerParameterf = (PFNGLSAMPLERPARAMETERFPROC)(*load)("glSamplerParameterf");
      glad_glSamplerParameterfv = (PFNGLSAMPLERPARAMETERFVPROC)(*load)("glSamplerParameterfv");
      glad_glSamplerParameterIiv = (PFNGLSAMPLERPARAMETERIIVPROC)(*load)("glSamplerParameterIiv");
      glad_glSamplerParameterIuiv = (PFNGLSAMPLERPARAMETERIUIVPROC)(*load)("glSamplerParameterIuiv")
      ;
      glad_glGetSamplerParameteriv =
           (PFNGLGETSAMPLERPARAMETERIVPROC)(*load)("glGetSamplerParameteriv");
      glad_glGetSamplerParameterIiv =
           (PFNGLGETSAMPLERPARAMETERIIVPROC)(*load)("glGetSamplerParameterIiv");
      glad_glGetSamplerParameterfv =
           (PFNGLGETSAMPLERPARAMETERFVPROC)(*load)("glGetSamplerParameterfv");
      glad_glGetSamplerParameterIuiv =
           (PFNGLGETSAMPLERPARAMETERIUIVPROC)(*load)("glGetSamplerParameterIuiv");
      glad_glQueryCounter = (PFNGLQUERYCOUNTERPROC)(*load)("glQueryCounter");
      glad_glGetQueryObjecti64v = (PFNGLGETQUERYOBJECTI64VPROC)(*load)("glGetQueryObjecti64v");
      glad_glGetQueryObjectui64v = (PFNGLGETQUERYOBJECTUI64VPROC)(*load)("glGetQueryObjectui64v");
      glad_glVertexAttribDivisor = (PFNGLVERTEXATTRIBDIVISORPROC)(*load)("glVertexAttribDivisor");
      glad_glVertexAttribP1ui = (PFNGLVERTEXATTRIBP1UIPROC)(*load)("glVertexAttribP1ui");
      glad_glVertexAttribP1uiv = (PFNGLVERTEXATTRIBP1UIVPROC)(*load)("glVertexAttribP1uiv");
      glad_glVertexAttribP2ui = (PFNGLVERTEXATTRIBP2UIPROC)(*load)("glVertexAttribP2ui");
      glad_glVertexAttribP2uiv = (PFNGLVERTEXATTRIBP2UIVPROC)(*load)("glVertexAttribP2uiv");
      glad_glVertexAttribP3ui = (PFNGLVERTEXATTRIBP3UIPROC)(*load)("glVertexAttribP3ui");
      glad_glVertexAttribP3uiv = (PFNGLVERTEXATTRIBP3UIVPROC)(*load)("glVertexAttribP3uiv");
      glad_glVertexAttribP4ui = (PFNGLVERTEXATTRIBP4UIPROC)(*load)("glVertexAttribP4ui");
      glad_glVertexAttribP4uiv = (PFNGLVERTEXATTRIBP4UIVPROC)(*load)("glVertexAttribP4uiv");
      glad_glVertexP2ui = (PFNGLVERTEXP2UIPROC)(*load)("glVertexP2ui");
      glad_glVertexP2uiv = (PFNGLVERTEXP2UIVPROC)(*load)("glVertexP2uiv");
      glad_glVertexP3ui = (PFNGLVERTEXP3UIPROC)(*load)("glVertexP3ui");
      glad_glVertexP3uiv = (PFNGLVERTEXP3UIVPROC)(*load)("glVertexP3uiv");
      glad_glVertexP4ui = (PFNGLVERTEXP4UIPROC)(*load)("glVertexP4ui");
      glad_glVertexP4uiv = (PFNGLVERTEXP4UIVPROC)(*load)("glVertexP4uiv");
      glad_glTexCoordP1ui = (PFNGLTEXCOORDP1UIPROC)(*load)("glTexCoordP1ui");
      glad_glTexCoordP1uiv = (PFNGLTEXCOORDP1UIVPROC)(*load)("glTexCoordP1uiv");
      glad_glTexCoordP2ui = (PFNGLTEXCOORDP2UIPROC)(*load)("glTexCoordP2ui");
      glad_glTexCoordP2uiv = (PFNGLTEXCOORDP2UIVPROC)(*load)("glTexCoordP2uiv");
      glad_glTexCoordP3ui = (PFNGLTEXCOORDP3UIPROC)(*load)("glTexCoordP3ui");
      glad_glTexCoordP3uiv = (PFNGLTEXCOORDP3UIVPROC)(*load)("glTexCoordP3uiv");
      glad_glTexCoordP4ui = (PFNGLTEXCOORDP4UIPROC)(*load)("glTexCoordP4ui");
      glad_glTexCoordP4uiv = (PFNGLTEXCOORDP4UIVPROC)(*load)("glTexCoordP4uiv");
      glad_glMultiTexCoordP1ui = (PFNGLMULTITEXCOORDP1UIPROC)(*load)("glMultiTexCoordP1ui");
      glad_glMultiTexCoordP1uiv = (PFNGLMULTITEXCOORDP1UIVPROC)(*load)("glMultiTexCoordP1uiv");
      glad_glMultiTexCoordP2ui = (PFNGLMULTITEXCOORDP2UIPROC)(*load)("glMultiTexCoordP2ui");
      glad_glMultiTexCoordP2uiv = (PFNGLMULTITEXCOORDP2UIVPROC)(*load)("glMultiTexCoordP2uiv");
      glad_glMultiTexCoordP3ui = (PFNGLMULTITEXCOORDP3UIPROC)(*load)("glMultiTexCoordP3ui");
      glad_glMultiTexCoordP3uiv = (PFNGLMULTITEXCOORDP3UIVPROC)(*load)("glMultiTexCoordP3uiv");
      glad_glMultiTexCoordP4ui = (PFNGLMULTITEXCOORDP4UIPROC)(*load)("glMultiTexCoordP4ui");
      glad_glMultiTexCoordP4uiv = (PFNGLMULTITEXCOORDP4UIVPROC)(*load)("glMultiTexCoordP4uiv");
      glad_glNormalP3ui = (PFNGLNORMALP3UIPROC)(*load)("glNormalP3ui");
      glad_glNormalP3uiv = (PFNGLNORMALP3UIVPROC)(*load)("glNormalP3uiv");
      glad_glColorP3ui = (PFNGLCOLORP3UIPROC)(*load)("glColorP3ui");
      glad_glColorP3uiv = (PFNGLCOLORP3UIVPROC)(*load)("glColorP3uiv");
      glad_glColorP4ui = (PFNGLCOLORP4UIPROC)(*load)("glColorP4ui");
      glad_glColorP4uiv = (PFNGLCOLORP4UIVPROC)(*load)("glColorP4uiv");
      glad_glSecondaryColorP3ui = (PFNGLSECONDARYCOLORP3UIPROC)(*load)("glSecondaryColorP3ui");
      glad_glSecondaryColorP3uiv = (PFNGLSECONDARYCOLORP3UIVPROC)(*load)("glSecondaryColorP3uiv");
    }
    if (max_loaded_major < 3) {
      exts = (char *)(*glad_glGetString)(0x1f03);
    }
    else {
      num_exts_i = 0;
      (*glad_glGetIntegerv)(0x821d,&num_exts_i);
      if (0 < (long)num_exts_i) {
        exts_i = (char **)realloc(exts_i,(long)num_exts_i << 3);
      }
      if (exts_i == (char **)0x0) {
        return 0;
      }
      if (0 < num_exts_i) {
        lVar7 = 0;
        do {
          pGVar4 = (*glad_glGetStringi)(0x1f03,(GLuint)lVar7);
          exts_i[lVar7] = (char *)pGVar4;
          lVar7 = lVar7 + 1;
        } while (lVar7 < num_exts_i);
      }
    }
    GLAD_GL_AMD_debug_output = has_ext("GL_AMD_debug_output");
    GLAD_GL_AMD_query_buffer_object = has_ext("GL_AMD_query_buffer_object");
    GLAD_GL_ARB_ES2_compatibility = has_ext("GL_ARB_ES2_compatibility");
    GLAD_GL_ARB_ES3_compatibility = has_ext("GL_ARB_ES3_compatibility");
    GLAD_GL_ARB_buffer_storage = has_ext("GL_ARB_buffer_storage");
    GLAD_GL_ARB_compatibility = has_ext("GL_ARB_compatibility");
    GLAD_GL_ARB_compressed_texture_pixel_storage =
         has_ext("GL_ARB_compressed_texture_pixel_storage");
    GLAD_GL_ARB_debug_output = has_ext("GL_ARB_debug_output");
    GLAD_GL_ARB_depth_buffer_float = has_ext("GL_ARB_depth_buffer_float");
    GLAD_GL_ARB_depth_clamp = has_ext("GL_ARB_depth_clamp");
    GLAD_GL_ARB_depth_texture = has_ext("GL_ARB_depth_texture");
    GLAD_GL_ARB_draw_buffers = has_ext("GL_ARB_draw_buffers");
    GLAD_GL_ARB_draw_buffers_blend = has_ext("GL_ARB_draw_buffers_blend");
    GLAD_GL_ARB_explicit_attrib_location = has_ext("GL_ARB_explicit_attrib_location");
    GLAD_GL_ARB_explicit_uniform_location = has_ext("GL_ARB_explicit_uniform_location");
    GLAD_GL_ARB_fragment_program = has_ext("GL_ARB_fragment_program");
    GLAD_GL_ARB_fragment_shader = has_ext("GL_ARB_fragment_shader");
    GLAD_GL_ARB_framebuffer_object = has_ext("GL_ARB_framebuffer_object");
    GLAD_GL_ARB_framebuffer_sRGB = has_ext("GL_ARB_framebuffer_sRGB");
    GLAD_GL_ARB_multisample = has_ext("GL_ARB_multisample");
    GLAD_GL_ARB_sample_locations = has_ext("GL_ARB_sample_locations");
    GLAD_GL_ARB_texture_compression = has_ext("GL_ARB_texture_compression");
    GLAD_GL_ARB_texture_float = has_ext("GL_ARB_texture_float");
    GLAD_GL_ARB_texture_multisample = has_ext("GL_ARB_texture_multisample");
    GLAD_GL_ARB_texture_non_power_of_two = has_ext("GL_ARB_texture_non_power_of_two");
    GLAD_GL_ARB_texture_rg = has_ext("GL_ARB_texture_rg");
    GLAD_GL_ARB_texture_swizzle = has_ext("GL_ARB_texture_swizzle");
    GLAD_GL_ARB_uniform_buffer_object = has_ext("GL_ARB_uniform_buffer_object");
    GLAD_GL_ARB_vertex_array_object = has_ext("GL_ARB_vertex_array_object");
    GLAD_GL_ARB_vertex_attrib_binding = has_ext("GL_ARB_vertex_attrib_binding");
    GLAD_GL_ARB_vertex_buffer_object = has_ext("GL_ARB_vertex_buffer_object");
    GLAD_GL_ARB_vertex_program = has_ext("GL_ARB_vertex_program");
    GLAD_GL_ARB_vertex_shader = has_ext("GL_ARB_vertex_shader");
    GLAD_GL_ATI_element_array = has_ext("GL_ATI_element_array");
    GLAD_GL_ATI_fragment_shader = has_ext("GL_ATI_fragment_shader");
    GLAD_GL_ATI_vertex_array_object = has_ext("GL_ATI_vertex_array_object");
    GLAD_GL_EXT_blend_color = has_ext("GL_EXT_blend_color");
    GLAD_GL_EXT_blend_equation_separate = has_ext("GL_EXT_blend_equation_separate");
    GLAD_GL_EXT_blend_func_separate = has_ext("GL_EXT_blend_func_separate");
    GLAD_GL_EXT_debug_marker = has_ext("GL_EXT_debug_marker");
    GLAD_GL_EXT_framebuffer_blit = has_ext("GL_EXT_framebuffer_blit");
    GLAD_GL_EXT_framebuffer_multisample = has_ext("GL_EXT_framebuffer_multisample");
    GLAD_GL_EXT_framebuffer_multisample_blit_scaled =
         has_ext("GL_EXT_framebuffer_multisample_blit_scaled");
    GLAD_GL_EXT_framebuffer_object = has_ext("GL_EXT_framebuffer_object");
    GLAD_GL_EXT_framebuffer_sRGB = has_ext("GL_EXT_framebuffer_sRGB");
    GLAD_GL_EXT_index_array_formats = has_ext("GL_EXT_index_array_formats");
    GLAD_GL_EXT_texture = has_ext("GL_EXT_texture");
    GLAD_GL_EXT_texture_compression_s3tc = has_ext("GL_EXT_texture_compression_s3tc");
    GLAD_GL_EXT_texture_sRGB = has_ext("GL_EXT_texture_sRGB");
    GLAD_GL_EXT_texture_swizzle = has_ext("GL_EXT_texture_swizzle");
    GLAD_GL_EXT_vertex_array = has_ext("GL_EXT_vertex_array");
    GLAD_GL_EXT_vertex_shader = has_ext("GL_EXT_vertex_shader");
    if (exts_i != (char **)0x0) {
      free(exts_i);
      exts_i = (char **)0x0;
    }
    if (GLAD_GL_AMD_debug_output != 0) {
      glad_glDebugMessageEnableAMD =
           (PFNGLDEBUGMESSAGEENABLEAMDPROC)(*load)("glDebugMessageEnableAMD");
      glad_glDebugMessageInsertAMD =
           (PFNGLDEBUGMESSAGEINSERTAMDPROC)(*load)("glDebugMessageInsertAMD");
      glad_glDebugMessageCallbackAMD =
           (PFNGLDEBUGMESSAGECALLBACKAMDPROC)(*load)("glDebugMessageCallbackAMD");
      glad_glGetDebugMessageLogAMD =
           (PFNGLGETDEBUGMESSAGELOGAMDPROC)(*load)("glGetDebugMessageLogAMD");
    }
    if (GLAD_GL_ARB_ES2_compatibility != 0) {
      glad_glReleaseShaderCompiler =
           (PFNGLRELEASESHADERCOMPILERPROC)(*load)("glReleaseShaderCompiler");
      glad_glShaderBinary = (PFNGLSHADERBINARYPROC)(*load)("glShaderBinary");
      glad_glGetShaderPrecisionFormat =
           (PFNGLGETSHADERPRECISIONFORMATPROC)(*load)("glGetShaderPrecisionFormat");
      glad_glDepthRangef = (PFNGLDEPTHRANGEFPROC)(*load)("glDepthRangef");
      glad_glClearDepthf = (PFNGLCLEARDEPTHFPROC)(*load)("glClearDepthf");
    }
    if (GLAD_GL_ARB_buffer_storage != 0) {
      glad_glBufferStorage = (PFNGLBUFFERSTORAGEPROC)(*load)("glBufferStorage");
    }
    if (GLAD_GL_ARB_debug_output != 0) {
      glad_glDebugMessageControlARB =
           (PFNGLDEBUGMESSAGECONTROLARBPROC)(*load)("glDebugMessageControlARB");
      glad_glDebugMessageInsertARB =
           (PFNGLDEBUGMESSAGEINSERTARBPROC)(*load)("glDebugMessageInsertARB");
      glad_glDebugMessageCallbackARB =
           (PFNGLDEBUGMESSAGECALLBACKARBPROC)(*load)("glDebugMessageCallbackARB");
      glad_glGetDebugMessageLogARB =
           (PFNGLGETDEBUGMESSAGELOGARBPROC)(*load)("glGetDebugMessageLogARB");
    }
    if (GLAD_GL_ARB_draw_buffers != 0) {
      glad_glDrawBuffersARB = (PFNGLDRAWBUFFERSARBPROC)(*load)("glDrawBuffersARB");
    }
    if (GLAD_GL_ARB_draw_buffers_blend != 0) {
      glad_glBlendEquationiARB = (PFNGLBLENDEQUATIONIARBPROC)(*load)("glBlendEquationiARB");
      glad_glBlendEquationSeparateiARB =
           (PFNGLBLENDEQUATIONSEPARATEIARBPROC)(*load)("glBlendEquationSeparateiARB");
      glad_glBlendFunciARB = (PFNGLBLENDFUNCIARBPROC)(*load)("glBlendFunciARB");
      glad_glBlendFuncSeparateiARB =
           (PFNGLBLENDFUNCSEPARATEIARBPROC)(*load)("glBlendFuncSeparateiARB");
    }
    if (GLAD_GL_ARB_fragment_program != 0) {
      glad_glProgramStringARB = (PFNGLPROGRAMSTRINGARBPROC)(*load)("glProgramStringARB");
      glad_glBindProgramARB = (PFNGLBINDPROGRAMARBPROC)(*load)("glBindProgramARB");
      glad_glDeleteProgramsARB = (PFNGLDELETEPROGRAMSARBPROC)(*load)("glDeleteProgramsARB");
      glad_glGenProgramsARB = (PFNGLGENPROGRAMSARBPROC)(*load)("glGenProgramsARB");
      glad_glProgramEnvParameter4dARB =
           (PFNGLPROGRAMENVPARAMETER4DARBPROC)(*load)("glProgramEnvParameter4dARB");
      glad_glProgramEnvParameter4dvARB =
           (PFNGLPROGRAMENVPARAMETER4DVARBPROC)(*load)("glProgramEnvParameter4dvARB");
      glad_glProgramEnvParameter4fARB =
           (PFNGLPROGRAMENVPARAMETER4FARBPROC)(*load)("glProgramEnvParameter4fARB");
      glad_glProgramEnvParameter4fvARB =
           (PFNGLPROGRAMENVPARAMETER4FVARBPROC)(*load)("glProgramEnvParameter4fvARB");
      glad_glProgramLocalParameter4dARB =
           (PFNGLPROGRAMLOCALPARAMETER4DARBPROC)(*load)("glProgramLocalParameter4dARB");
      glad_glProgramLocalParameter4dvARB =
           (PFNGLPROGRAMLOCALPARAMETER4DVARBPROC)(*load)("glProgramLocalParameter4dvARB");
      glad_glProgramLocalParameter4fARB =
           (PFNGLPROGRAMLOCALPARAMETER4FARBPROC)(*load)("glProgramLocalParameter4fARB");
      glad_glProgramLocalParameter4fvARB =
           (PFNGLPROGRAMLOCALPARAMETER4FVARBPROC)(*load)("glProgramLocalParameter4fvARB");
      glad_glGetProgramEnvParameterdvARB =
           (PFNGLGETPROGRAMENVPARAMETERDVARBPROC)(*load)("glGetProgramEnvParameterdvARB");
      glad_glGetProgramEnvParameterfvARB =
           (PFNGLGETPROGRAMENVPARAMETERFVARBPROC)(*load)("glGetProgramEnvParameterfvARB");
      glad_glGetProgramLocalParameterdvARB =
           (PFNGLGETPROGRAMLOCALPARAMETERDVARBPROC)(*load)("glGetProgramLocalParameterdvARB");
      glad_glGetProgramLocalParameterfvARB =
           (PFNGLGETPROGRAMLOCALPARAMETERFVARBPROC)(*load)("glGetProgramLocalParameterfvARB");
      glad_glGetProgramivARB = (PFNGLGETPROGRAMIVARBPROC)(*load)("glGetProgramivARB");
      glad_glGetProgramStringARB = (PFNGLGETPROGRAMSTRINGARBPROC)(*load)("glGetProgramStringARB");
      glad_glIsProgramARB = (PFNGLISPROGRAMARBPROC)(*load)("glIsProgramARB");
    }
    if (GLAD_GL_ARB_framebuffer_object != 0) {
      glad_glIsRenderbuffer = (PFNGLISRENDERBUFFERPROC)(*load)("glIsRenderbuffer");
      glad_glBindRenderbuffer = (PFNGLBINDRENDERBUFFERPROC)(*load)("glBindRenderbuffer");
      glad_glDeleteRenderbuffers = (PFNGLDELETERENDERBUFFERSPROC)(*load)("glDeleteRenderbuffers");
      glad_glGenRenderbuffers = (PFNGLGENRENDERBUFFERSPROC)(*load)("glGenRenderbuffers");
      glad_glRenderbufferStorage = (PFNGLRENDERBUFFERSTORAGEPROC)(*load)("glRenderbufferStorage");
      glad_glGetRenderbufferParameteriv =
           (PFNGLGETRENDERBUFFERPARAMETERIVPROC)(*load)("glGetRenderbufferParameteriv");
      glad_glIsFramebuffer = (PFNGLISFRAMEBUFFERPROC)(*load)("glIsFramebuffer");
      glad_glBindFramebuffer = (PFNGLBINDFRAMEBUFFERPROC)(*load)("glBindFramebuffer");
      glad_glDeleteFramebuffers = (PFNGLDELETEFRAMEBUFFERSPROC)(*load)("glDeleteFramebuffers");
      glad_glGenFramebuffers = (PFNGLGENFRAMEBUFFERSPROC)(*load)("glGenFramebuffers");
      glad_glCheckFramebufferStatus =
           (PFNGLCHECKFRAMEBUFFERSTATUSPROC)(*load)("glCheckFramebufferStatus");
      glad_glFramebufferTexture1D = (PFNGLFRAMEBUFFERTEXTURE1DPROC)(*load)("glFramebufferTexture1D")
      ;
      glad_glFramebufferTexture2D = (PFNGLFRAMEBUFFERTEXTURE2DPROC)(*load)("glFramebufferTexture2D")
      ;
      glad_glFramebufferTexture3D = (PFNGLFRAMEBUFFERTEXTURE3DPROC)(*load)("glFramebufferTexture3D")
      ;
      glad_glFramebufferRenderbuffer =
           (PFNGLFRAMEBUFFERRENDERBUFFERPROC)(*load)("glFramebufferRenderbuffer");
      glad_glGetFramebufferAttachmentParameteriv =
           (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVPROC)
           (*load)("glGetFramebufferAttachmentParameteriv");
      glad_glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)(*load)("glGenerateMipmap");
      glad_glBlitFramebuffer = (PFNGLBLITFRAMEBUFFERPROC)(*load)("glBlitFramebuffer");
      glad_glRenderbufferStorageMultisample =
           (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEPROC)(*load)("glRenderbufferStorageMultisample");
      glad_glFramebufferTextureLayer =
           (PFNGLFRAMEBUFFERTEXTURELAYERPROC)(*load)("glFramebufferTextureLayer");
    }
    if (GLAD_GL_ARB_multisample != 0) {
      glad_glSampleCoverageARB = (PFNGLSAMPLECOVERAGEARBPROC)(*load)("glSampleCoverageARB");
    }
    if (GLAD_GL_ARB_sample_locations != 0) {
      glad_glFramebufferSampleLocationsfvARB =
           (PFNGLFRAMEBUFFERSAMPLELOCATIONSFVARBPROC)(*load)("glFramebufferSampleLocationsfvARB");
      glad_glNamedFramebufferSampleLocationsfvARB =
           (PFNGLNAMEDFRAMEBUFFERSAMPLELOCATIONSFVARBPROC)
           (*load)("glNamedFramebufferSampleLocationsfvARB");
      glad_glEvaluateDepthValuesARB =
           (PFNGLEVALUATEDEPTHVALUESARBPROC)(*load)("glEvaluateDepthValuesARB");
    }
    if (GLAD_GL_ARB_texture_compression != 0) {
      glad_glCompressedTexImage3DARB =
           (PFNGLCOMPRESSEDTEXIMAGE3DARBPROC)(*load)("glCompressedTexImage3DARB");
      glad_glCompressedTexImage2DARB =
           (PFNGLCOMPRESSEDTEXIMAGE2DARBPROC)(*load)("glCompressedTexImage2DARB");
      glad_glCompressedTexImage1DARB =
           (PFNGLCOMPRESSEDTEXIMAGE1DARBPROC)(*load)("glCompressedTexImage1DARB");
      glad_glCompressedTexSubImage3DARB =
           (PFNGLCOMPRESSEDTEXSUBIMAGE3DARBPROC)(*load)("glCompressedTexSubImage3DARB");
      glad_glCompressedTexSubImage2DARB =
           (PFNGLCOMPRESSEDTEXSUBIMAGE2DARBPROC)(*load)("glCompressedTexSubImage2DARB");
      glad_glCompressedTexSubImage1DARB =
           (PFNGLCOMPRESSEDTEXSUBIMAGE1DARBPROC)(*load)("glCompressedTexSubImage1DARB");
      glad_glGetCompressedTexImageARB =
           (PFNGLGETCOMPRESSEDTEXIMAGEARBPROC)(*load)("glGetCompressedTexImageARB");
    }
    if (GLAD_GL_ARB_texture_multisample != 0) {
      glad_glTexImage2DMultisample =
           (PFNGLTEXIMAGE2DMULTISAMPLEPROC)(*load)("glTexImage2DMultisample");
      glad_glTexImage3DMultisample =
           (PFNGLTEXIMAGE3DMULTISAMPLEPROC)(*load)("glTexImage3DMultisample");
      glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC)(*load)("glGetMultisamplefv");
      glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)(*load)("glSampleMaski");
    }
    if (GLAD_GL_ARB_uniform_buffer_object != 0) {
      glad_glGetUniformIndices = (PFNGLGETUNIFORMINDICESPROC)(*load)("glGetUniformIndices");
      glad_glGetActiveUniformsiv = (PFNGLGETACTIVEUNIFORMSIVPROC)(*load)("glGetActiveUniformsiv");
      glad_glGetActiveUniformName = (PFNGLGETACTIVEUNIFORMNAMEPROC)(*load)("glGetActiveUniformName")
      ;
      glad_glGetUniformBlockIndex = (PFNGLGETUNIFORMBLOCKINDEXPROC)(*load)("glGetUniformBlockIndex")
      ;
      glad_glGetActiveUniformBlockiv =
           (PFNGLGETACTIVEUNIFORMBLOCKIVPROC)(*load)("glGetActiveUniformBlockiv");
      glad_glGetActiveUniformBlockName =
           (PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC)(*load)("glGetActiveUniformBlockName");
      glad_glUniformBlockBinding = (PFNGLUNIFORMBLOCKBINDINGPROC)(*load)("glUniformBlockBinding");
      glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)("glBindBufferRange");
      glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)("glBindBufferBase");
      glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*load)("glGetIntegeri_v");
    }
    if (GLAD_GL_ARB_vertex_array_object != 0) {
      glad_glBindVertexArray = (PFNGLBINDVERTEXARRAYPROC)(*load)("glBindVertexArray");
      glad_glDeleteVertexArrays = (PFNGLDELETEVERTEXARRAYSPROC)(*load)("glDeleteVertexArrays");
      glad_glGenVertexArrays = (PFNGLGENVERTEXARRAYSPROC)(*load)("glGenVertexArrays");
      glad_glIsVertexArray = (PFNGLISVERTEXARRAYPROC)(*load)("glIsVertexArray");
    }
    if (GLAD_GL_ARB_vertex_attrib_binding != 0) {
      glad_glBindVertexBuffer = (PFNGLBINDVERTEXBUFFERPROC)(*load)("glBindVertexBuffer");
      glad_glVertexAttribFormat = (PFNGLVERTEXATTRIBFORMATPROC)(*load)("glVertexAttribFormat");
      glad_glVertexAttribIFormat = (PFNGLVERTEXATTRIBIFORMATPROC)(*load)("glVertexAttribIFormat");
      glad_glVertexAttribLFormat = (PFNGLVERTEXATTRIBLFORMATPROC)(*load)("glVertexAttribLFormat");
      glad_glVertexAttribBinding = (PFNGLVERTEXATTRIBBINDINGPROC)(*load)("glVertexAttribBinding");
      glad_glVertexBindingDivisor = (PFNGLVERTEXBINDINGDIVISORPROC)(*load)("glVertexBindingDivisor")
      ;
    }
    if (GLAD_GL_ARB_vertex_buffer_object != 0) {
      glad_glBindBufferARB = (PFNGLBINDBUFFERARBPROC)(*load)("glBindBufferARB");
      glad_glDeleteBuffersARB = (PFNGLDELETEBUFFERSARBPROC)(*load)("glDeleteBuffersARB");
      glad_glGenBuffersARB = (PFNGLGENBUFFERSARBPROC)(*load)("glGenBuffersARB");
      glad_glIsBufferARB = (PFNGLISBUFFERARBPROC)(*load)("glIsBufferARB");
      glad_glBufferDataARB = (PFNGLBUFFERDATAARBPROC)(*load)("glBufferDataARB");
      glad_glBufferSubDataARB = (PFNGLBUFFERSUBDATAARBPROC)(*load)("glBufferSubDataARB");
      glad_glGetBufferSubDataARB = (PFNGLGETBUFFERSUBDATAARBPROC)(*load)("glGetBufferSubDataARB");
      glad_glMapBufferARB = (PFNGLMAPBUFFERARBPROC)(*load)("glMapBufferARB");
      glad_glUnmapBufferARB = (PFNGLUNMAPBUFFERARBPROC)(*load)("glUnmapBufferARB");
      glad_glGetBufferParameterivARB =
           (PFNGLGETBUFFERPARAMETERIVARBPROC)(*load)("glGetBufferParameterivARB");
      glad_glGetBufferPointervARB = (PFNGLGETBUFFERPOINTERVARBPROC)(*load)("glGetBufferPointervARB")
      ;
    }
    if (GLAD_GL_ARB_vertex_program != 0) {
      glad_glVertexAttrib1dARB = (PFNGLVERTEXATTRIB1DARBPROC)(*load)("glVertexAttrib1dARB");
      glad_glVertexAttrib1dvARB = (PFNGLVERTEXATTRIB1DVARBPROC)(*load)("glVertexAttrib1dvARB");
      glad_glVertexAttrib1fARB = (PFNGLVERTEXATTRIB1FARBPROC)(*load)("glVertexAttrib1fARB");
      glad_glVertexAttrib1fvARB = (PFNGLVERTEXATTRIB1FVARBPROC)(*load)("glVertexAttrib1fvARB");
      glad_glVertexAttrib1sARB = (PFNGLVERTEXATTRIB1SARBPROC)(*load)("glVertexAttrib1sARB");
      glad_glVertexAttrib1svARB = (PFNGLVERTEXATTRIB1SVARBPROC)(*load)("glVertexAttrib1svARB");
      glad_glVertexAttrib2dARB = (PFNGLVERTEXATTRIB2DARBPROC)(*load)("glVertexAttrib2dARB");
      glad_glVertexAttrib2dvARB = (PFNGLVERTEXATTRIB2DVARBPROC)(*load)("glVertexAttrib2dvARB");
      glad_glVertexAttrib2fARB = (PFNGLVERTEXATTRIB2FARBPROC)(*load)("glVertexAttrib2fARB");
      glad_glVertexAttrib2fvARB = (PFNGLVERTEXATTRIB2FVARBPROC)(*load)("glVertexAttrib2fvARB");
      glad_glVertexAttrib2sARB = (PFNGLVERTEXATTRIB2SARBPROC)(*load)("glVertexAttrib2sARB");
      glad_glVertexAttrib2svARB = (PFNGLVERTEXATTRIB2SVARBPROC)(*load)("glVertexAttrib2svARB");
      glad_glVertexAttrib3dARB = (PFNGLVERTEXATTRIB3DARBPROC)(*load)("glVertexAttrib3dARB");
      glad_glVertexAttrib3dvARB = (PFNGLVERTEXATTRIB3DVARBPROC)(*load)("glVertexAttrib3dvARB");
      glad_glVertexAttrib3fARB = (PFNGLVERTEXATTRIB3FARBPROC)(*load)("glVertexAttrib3fARB");
      glad_glVertexAttrib3fvARB = (PFNGLVERTEXATTRIB3FVARBPROC)(*load)("glVertexAttrib3fvARB");
      glad_glVertexAttrib3sARB = (PFNGLVERTEXATTRIB3SARBPROC)(*load)("glVertexAttrib3sARB");
      glad_glVertexAttrib3svARB = (PFNGLVERTEXATTRIB3SVARBPROC)(*load)("glVertexAttrib3svARB");
      glad_glVertexAttrib4NbvARB = (PFNGLVERTEXATTRIB4NBVARBPROC)(*load)("glVertexAttrib4NbvARB");
      glad_glVertexAttrib4NivARB = (PFNGLVERTEXATTRIB4NIVARBPROC)(*load)("glVertexAttrib4NivARB");
      glad_glVertexAttrib4NsvARB = (PFNGLVERTEXATTRIB4NSVARBPROC)(*load)("glVertexAttrib4NsvARB");
      glad_glVertexAttrib4NubARB = (PFNGLVERTEXATTRIB4NUBARBPROC)(*load)("glVertexAttrib4NubARB");
      glad_glVertexAttrib4NubvARB = (PFNGLVERTEXATTRIB4NUBVARBPROC)(*load)("glVertexAttrib4NubvARB")
      ;
      glad_glVertexAttrib4NuivARB = (PFNGLVERTEXATTRIB4NUIVARBPROC)(*load)("glVertexAttrib4NuivARB")
      ;
      glad_glVertexAttrib4NusvARB = (PFNGLVERTEXATTRIB4NUSVARBPROC)(*load)("glVertexAttrib4NusvARB")
      ;
      glad_glVertexAttrib4bvARB = (PFNGLVERTEXATTRIB4BVARBPROC)(*load)("glVertexAttrib4bvARB");
      glad_glVertexAttrib4dARB = (PFNGLVERTEXATTRIB4DARBPROC)(*load)("glVertexAttrib4dARB");
      glad_glVertexAttrib4dvARB = (PFNGLVERTEXATTRIB4DVARBPROC)(*load)("glVertexAttrib4dvARB");
      glad_glVertexAttrib4fARB = (PFNGLVERTEXATTRIB4FARBPROC)(*load)("glVertexAttrib4fARB");
      glad_glVertexAttrib4fvARB = (PFNGLVERTEXATTRIB4FVARBPROC)(*load)("glVertexAttrib4fvARB");
      glad_glVertexAttrib4ivARB = (PFNGLVERTEXATTRIB4IVARBPROC)(*load)("glVertexAttrib4ivARB");
      glad_glVertexAttrib4sARB = (PFNGLVERTEXATTRIB4SARBPROC)(*load)("glVertexAttrib4sARB");
      glad_glVertexAttrib4svARB = (PFNGLVERTEXATTRIB4SVARBPROC)(*load)("glVertexAttrib4svARB");
      glad_glVertexAttrib4ubvARB = (PFNGLVERTEXATTRIB4UBVARBPROC)(*load)("glVertexAttrib4ubvARB");
      glad_glVertexAttrib4uivARB = (PFNGLVERTEXATTRIB4UIVARBPROC)(*load)("glVertexAttrib4uivARB");
      glad_glVertexAttrib4usvARB = (PFNGLVERTEXATTRIB4USVARBPROC)(*load)("glVertexAttrib4usvARB");
      glad_glVertexAttribPointerARB =
           (PFNGLVERTEXATTRIBPOINTERARBPROC)(*load)("glVertexAttribPointerARB");
      glad_glEnableVertexAttribArrayARB =
           (PFNGLENABLEVERTEXATTRIBARRAYARBPROC)(*load)("glEnableVertexAttribArrayARB");
      glad_glDisableVertexAttribArrayARB =
           (PFNGLDISABLEVERTEXATTRIBARRAYARBPROC)(*load)("glDisableVertexAttribArrayARB");
      glad_glProgramStringARB = (PFNGLPROGRAMSTRINGARBPROC)(*load)("glProgramStringARB");
      glad_glBindProgramARB = (PFNGLBINDPROGRAMARBPROC)(*load)("glBindProgramARB");
      glad_glDeleteProgramsARB = (PFNGLDELETEPROGRAMSARBPROC)(*load)("glDeleteProgramsARB");
      glad_glGenProgramsARB = (PFNGLGENPROGRAMSARBPROC)(*load)("glGenProgramsARB");
      glad_glProgramEnvParameter4dARB =
           (PFNGLPROGRAMENVPARAMETER4DARBPROC)(*load)("glProgramEnvParameter4dARB");
      glad_glProgramEnvParameter4dvARB =
           (PFNGLPROGRAMENVPARAMETER4DVARBPROC)(*load)("glProgramEnvParameter4dvARB");
      glad_glProgramEnvParameter4fARB =
           (PFNGLPROGRAMENVPARAMETER4FARBPROC)(*load)("glProgramEnvParameter4fARB");
      glad_glProgramEnvParameter4fvARB =
           (PFNGLPROGRAMENVPARAMETER4FVARBPROC)(*load)("glProgramEnvParameter4fvARB");
      glad_glProgramLocalParameter4dARB =
           (PFNGLPROGRAMLOCALPARAMETER4DARBPROC)(*load)("glProgramLocalParameter4dARB");
      glad_glProgramLocalParameter4dvARB =
           (PFNGLPROGRAMLOCALPARAMETER4DVARBPROC)(*load)("glProgramLocalParameter4dvARB");
      glad_glProgramLocalParameter4fARB =
           (PFNGLPROGRAMLOCALPARAMETER4FARBPROC)(*load)("glProgramLocalParameter4fARB");
      glad_glProgramLocalParameter4fvARB =
           (PFNGLPROGRAMLOCALPARAMETER4FVARBPROC)(*load)("glProgramLocalParameter4fvARB");
      glad_glGetProgramEnvParameterdvARB =
           (PFNGLGETPROGRAMENVPARAMETERDVARBPROC)(*load)("glGetProgramEnvParameterdvARB");
      glad_glGetProgramEnvParameterfvARB =
           (PFNGLGETPROGRAMENVPARAMETERFVARBPROC)(*load)("glGetProgramEnvParameterfvARB");
      glad_glGetProgramLocalParameterdvARB =
           (PFNGLGETPROGRAMLOCALPARAMETERDVARBPROC)(*load)("glGetProgramLocalParameterdvARB");
      glad_glGetProgramLocalParameterfvARB =
           (PFNGLGETPROGRAMLOCALPARAMETERFVARBPROC)(*load)("glGetProgramLocalParameterfvARB");
      glad_glGetProgramivARB = (PFNGLGETPROGRAMIVARBPROC)(*load)("glGetProgramivARB");
      glad_glGetProgramStringARB = (PFNGLGETPROGRAMSTRINGARBPROC)(*load)("glGetProgramStringARB");
      glad_glGetVertexAttribdvARB = (PFNGLGETVERTEXATTRIBDVARBPROC)(*load)("glGetVertexAttribdvARB")
      ;
      glad_glGetVertexAttribfvARB = (PFNGLGETVERTEXATTRIBFVARBPROC)(*load)("glGetVertexAttribfvARB")
      ;
      glad_glGetVertexAttribivARB = (PFNGLGETVERTEXATTRIBIVARBPROC)(*load)("glGetVertexAttribivARB")
      ;
      glad_glGetVertexAttribPointervARB =
           (PFNGLGETVERTEXATTRIBPOINTERVARBPROC)(*load)("glGetVertexAttribPointervARB");
      glad_glIsProgramARB = (PFNGLISPROGRAMARBPROC)(*load)("glIsProgramARB");
    }
    if (GLAD_GL_ARB_vertex_shader != 0) {
      glad_glVertexAttrib1fARB = (PFNGLVERTEXATTRIB1FARBPROC)(*load)("glVertexAttrib1fARB");
      glad_glVertexAttrib1sARB = (PFNGLVERTEXATTRIB1SARBPROC)(*load)("glVertexAttrib1sARB");
      glad_glVertexAttrib1dARB = (PFNGLVERTEXATTRIB1DARBPROC)(*load)("glVertexAttrib1dARB");
      glad_glVertexAttrib2fARB = (PFNGLVERTEXATTRIB2FARBPROC)(*load)("glVertexAttrib2fARB");
      glad_glVertexAttrib2sARB = (PFNGLVERTEXATTRIB2SARBPROC)(*load)("glVertexAttrib2sARB");
      glad_glVertexAttrib2dARB = (PFNGLVERTEXATTRIB2DARBPROC)(*load)("glVertexAttrib2dARB");
      glad_glVertexAttrib3fARB = (PFNGLVERTEXATTRIB3FARBPROC)(*load)("glVertexAttrib3fARB");
      glad_glVertexAttrib3sARB = (PFNGLVERTEXATTRIB3SARBPROC)(*load)("glVertexAttrib3sARB");
      glad_glVertexAttrib3dARB = (PFNGLVERTEXATTRIB3DARBPROC)(*load)("glVertexAttrib3dARB");
      glad_glVertexAttrib4fARB = (PFNGLVERTEXATTRIB4FARBPROC)(*load)("glVertexAttrib4fARB");
      glad_glVertexAttrib4sARB = (PFNGLVERTEXATTRIB4SARBPROC)(*load)("glVertexAttrib4sARB");
      glad_glVertexAttrib4dARB = (PFNGLVERTEXATTRIB4DARBPROC)(*load)("glVertexAttrib4dARB");
      glad_glVertexAttrib4NubARB = (PFNGLVERTEXATTRIB4NUBARBPROC)(*load)("glVertexAttrib4NubARB");
      glad_glVertexAttrib1fvARB = (PFNGLVERTEXATTRIB1FVARBPROC)(*load)("glVertexAttrib1fvARB");
      glad_glVertexAttrib1svARB = (PFNGLVERTEXATTRIB1SVARBPROC)(*load)("glVertexAttrib1svARB");
      glad_glVertexAttrib1dvARB = (PFNGLVERTEXATTRIB1DVARBPROC)(*load)("glVertexAttrib1dvARB");
      glad_glVertexAttrib2fvARB = (PFNGLVERTEXATTRIB2FVARBPROC)(*load)("glVertexAttrib2fvARB");
      glad_glVertexAttrib2svARB = (PFNGLVERTEXATTRIB2SVARBPROC)(*load)("glVertexAttrib2svARB");
      glad_glVertexAttrib2dvARB = (PFNGLVERTEXATTRIB2DVARBPROC)(*load)("glVertexAttrib2dvARB");
      glad_glVertexAttrib3fvARB = (PFNGLVERTEXATTRIB3FVARBPROC)(*load)("glVertexAttrib3fvARB");
      glad_glVertexAttrib3svARB = (PFNGLVERTEXATTRIB3SVARBPROC)(*load)("glVertexAttrib3svARB");
      glad_glVertexAttrib3dvARB = (PFNGLVERTEXATTRIB3DVARBPROC)(*load)("glVertexAttrib3dvARB");
      glad_glVertexAttrib4fvARB = (PFNGLVERTEXATTRIB4FVARBPROC)(*load)("glVertexAttrib4fvARB");
      glad_glVertexAttrib4svARB = (PFNGLVERTEXATTRIB4SVARBPROC)(*load)("glVertexAttrib4svARB");
      glad_glVertexAttrib4dvARB = (PFNGLVERTEXATTRIB4DVARBPROC)(*load)("glVertexAttrib4dvARB");
      glad_glVertexAttrib4ivARB = (PFNGLVERTEXATTRIB4IVARBPROC)(*load)("glVertexAttrib4ivARB");
      glad_glVertexAttrib4bvARB = (PFNGLVERTEXATTRIB4BVARBPROC)(*load)("glVertexAttrib4bvARB");
      glad_glVertexAttrib4ubvARB = (PFNGLVERTEXATTRIB4UBVARBPROC)(*load)("glVertexAttrib4ubvARB");
      glad_glVertexAttrib4usvARB = (PFNGLVERTEXATTRIB4USVARBPROC)(*load)("glVertexAttrib4usvARB");
      glad_glVertexAttrib4uivARB = (PFNGLVERTEXATTRIB4UIVARBPROC)(*load)("glVertexAttrib4uivARB");
      glad_glVertexAttrib4NbvARB = (PFNGLVERTEXATTRIB4NBVARBPROC)(*load)("glVertexAttrib4NbvARB");
      glad_glVertexAttrib4NsvARB = (PFNGLVERTEXATTRIB4NSVARBPROC)(*load)("glVertexAttrib4NsvARB");
      glad_glVertexAttrib4NivARB = (PFNGLVERTEXATTRIB4NIVARBPROC)(*load)("glVertexAttrib4NivARB");
      glad_glVertexAttrib4NubvARB = (PFNGLVERTEXATTRIB4NUBVARBPROC)(*load)("glVertexAttrib4NubvARB")
      ;
      glad_glVertexAttrib4NusvARB = (PFNGLVERTEXATTRIB4NUSVARBPROC)(*load)("glVertexAttrib4NusvARB")
      ;
      glad_glVertexAttrib4NuivARB = (PFNGLVERTEXATTRIB4NUIVARBPROC)(*load)("glVertexAttrib4NuivARB")
      ;
      glad_glVertexAttribPointerARB =
           (PFNGLVERTEXATTRIBPOINTERARBPROC)(*load)("glVertexAttribPointerARB");
      glad_glEnableVertexAttribArrayARB =
           (PFNGLENABLEVERTEXATTRIBARRAYARBPROC)(*load)("glEnableVertexAttribArrayARB");
      glad_glDisableVertexAttribArrayARB =
           (PFNGLDISABLEVERTEXATTRIBARRAYARBPROC)(*load)("glDisableVertexAttribArrayARB");
      glad_glBindAttribLocationARB =
           (PFNGLBINDATTRIBLOCATIONARBPROC)(*load)("glBindAttribLocationARB");
      glad_glGetActiveAttribARB = (PFNGLGETACTIVEATTRIBARBPROC)(*load)("glGetActiveAttribARB");
      glad_glGetAttribLocationARB = (PFNGLGETATTRIBLOCATIONARBPROC)(*load)("glGetAttribLocationARB")
      ;
      glad_glGetVertexAttribdvARB = (PFNGLGETVERTEXATTRIBDVARBPROC)(*load)("glGetVertexAttribdvARB")
      ;
      glad_glGetVertexAttribfvARB = (PFNGLGETVERTEXATTRIBFVARBPROC)(*load)("glGetVertexAttribfvARB")
      ;
      glad_glGetVertexAttribivARB = (PFNGLGETVERTEXATTRIBIVARBPROC)(*load)("glGetVertexAttribivARB")
      ;
      glad_glGetVertexAttribPointervARB =
           (PFNGLGETVERTEXATTRIBPOINTERVARBPROC)(*load)("glGetVertexAttribPointervARB");
    }
    if (GLAD_GL_ATI_element_array != 0) {
      glad_glElementPointerATI = (PFNGLELEMENTPOINTERATIPROC)(*load)("glElementPointerATI");
      glad_glDrawElementArrayATI = (PFNGLDRAWELEMENTARRAYATIPROC)(*load)("glDrawElementArrayATI");
      glad_glDrawRangeElementArrayATI =
           (PFNGLDRAWRANGEELEMENTARRAYATIPROC)(*load)("glDrawRangeElementArrayATI");
    }
    if (GLAD_GL_ATI_fragment_shader != 0) {
      glad_glGenFragmentShadersATI =
           (PFNGLGENFRAGMENTSHADERSATIPROC)(*load)("glGenFragmentShadersATI");
      glad_glBindFragmentShaderATI =
           (PFNGLBINDFRAGMENTSHADERATIPROC)(*load)("glBindFragmentShaderATI");
      glad_glDeleteFragmentShaderATI =
           (PFNGLDELETEFRAGMENTSHADERATIPROC)(*load)("glDeleteFragmentShaderATI");
      glad_glBeginFragmentShaderATI =
           (PFNGLBEGINFRAGMENTSHADERATIPROC)(*load)("glBeginFragmentShaderATI");
      glad_glEndFragmentShaderATI = (PFNGLENDFRAGMENTSHADERATIPROC)(*load)("glEndFragmentShaderATI")
      ;
      glad_glPassTexCoordATI = (PFNGLPASSTEXCOORDATIPROC)(*load)("glPassTexCoordATI");
      glad_glSampleMapATI = (PFNGLSAMPLEMAPATIPROC)(*load)("glSampleMapATI");
      glad_glColorFragmentOp1ATI = (PFNGLCOLORFRAGMENTOP1ATIPROC)(*load)("glColorFragmentOp1ATI");
      glad_glColorFragmentOp2ATI = (PFNGLCOLORFRAGMENTOP2ATIPROC)(*load)("glColorFragmentOp2ATI");
      glad_glColorFragmentOp3ATI = (PFNGLCOLORFRAGMENTOP3ATIPROC)(*load)("glColorFragmentOp3ATI");
      glad_glAlphaFragmentOp1ATI = (PFNGLALPHAFRAGMENTOP1ATIPROC)(*load)("glAlphaFragmentOp1ATI");
      glad_glAlphaFragmentOp2ATI = (PFNGLALPHAFRAGMENTOP2ATIPROC)(*load)("glAlphaFragmentOp2ATI");
      glad_glAlphaFragmentOp3ATI = (PFNGLALPHAFRAGMENTOP3ATIPROC)(*load)("glAlphaFragmentOp3ATI");
      glad_glSetFragmentShaderConstantATI =
           (PFNGLSETFRAGMENTSHADERCONSTANTATIPROC)(*load)("glSetFragmentShaderConstantATI");
    }
    if (GLAD_GL_ATI_vertex_array_object != 0) {
      glad_glNewObjectBufferATI = (PFNGLNEWOBJECTBUFFERATIPROC)(*load)("glNewObjectBufferATI");
      glad_glIsObjectBufferATI = (PFNGLISOBJECTBUFFERATIPROC)(*load)("glIsObjectBufferATI");
      glad_glUpdateObjectBufferATI =
           (PFNGLUPDATEOBJECTBUFFERATIPROC)(*load)("glUpdateObjectBufferATI");
      glad_glGetObjectBufferfvATI = (PFNGLGETOBJECTBUFFERFVATIPROC)(*load)("glGetObjectBufferfvATI")
      ;
      glad_glGetObjectBufferivATI = (PFNGLGETOBJECTBUFFERIVATIPROC)(*load)("glGetObjectBufferivATI")
      ;
      glad_glFreeObjectBufferATI = (PFNGLFREEOBJECTBUFFERATIPROC)(*load)("glFreeObjectBufferATI");
      glad_glArrayObjectATI = (PFNGLARRAYOBJECTATIPROC)(*load)("glArrayObjectATI");
      glad_glGetArrayObjectfvATI = (PFNGLGETARRAYOBJECTFVATIPROC)(*load)("glGetArrayObjectfvATI");
      glad_glGetArrayObjectivATI = (PFNGLGETARRAYOBJECTIVATIPROC)(*load)("glGetArrayObjectivATI");
      glad_glVariantArrayObjectATI =
           (PFNGLVARIANTARRAYOBJECTATIPROC)(*load)("glVariantArrayObjectATI");
      glad_glGetVariantArrayObjectfvATI =
           (PFNGLGETVARIANTARRAYOBJECTFVATIPROC)(*load)("glGetVariantArrayObjectfvATI");
      glad_glGetVariantArrayObjectivATI =
           (PFNGLGETVARIANTARRAYOBJECTIVATIPROC)(*load)("glGetVariantArrayObjectivATI");
    }
    if (GLAD_GL_EXT_blend_color != 0) {
      glad_glBlendColorEXT = (PFNGLBLENDCOLOREXTPROC)(*load)("glBlendColorEXT");
    }
    if (GLAD_GL_EXT_blend_equation_separate != 0) {
      glad_glBlendEquationSeparateEXT =
           (PFNGLBLENDEQUATIONSEPARATEEXTPROC)(*load)("glBlendEquationSeparateEXT");
    }
    if (GLAD_GL_EXT_blend_func_separate != 0) {
      glad_glBlendFuncSeparateEXT = (PFNGLBLENDFUNCSEPARATEEXTPROC)(*load)("glBlendFuncSeparateEXT")
      ;
    }
    if (GLAD_GL_EXT_debug_marker != 0) {
      glad_glInsertEventMarkerEXT = (PFNGLINSERTEVENTMARKEREXTPROC)(*load)("glInsertEventMarkerEXT")
      ;
      glad_glPushGroupMarkerEXT = (PFNGLPUSHGROUPMARKEREXTPROC)(*load)("glPushGroupMarkerEXT");
      glad_glPopGroupMarkerEXT = (PFNGLPOPGROUPMARKEREXTPROC)(*load)("glPopGroupMarkerEXT");
    }
    if (GLAD_GL_EXT_framebuffer_blit != 0) {
      glad_glBlitFramebufferEXT = (PFNGLBLITFRAMEBUFFEREXTPROC)(*load)("glBlitFramebufferEXT");
    }
    if (GLAD_GL_EXT_framebuffer_multisample != 0) {
      glad_glRenderbufferStorageMultisampleEXT =
           (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEEXTPROC)
           (*load)("glRenderbufferStorageMultisampleEXT");
    }
    if (GLAD_GL_EXT_framebuffer_object != 0) {
      glad_glIsRenderbufferEXT = (PFNGLISRENDERBUFFEREXTPROC)(*load)("glIsRenderbufferEXT");
      glad_glBindRenderbufferEXT = (PFNGLBINDRENDERBUFFEREXTPROC)(*load)("glBindRenderbufferEXT");
      glad_glDeleteRenderbuffersEXT =
           (PFNGLDELETERENDERBUFFERSEXTPROC)(*load)("glDeleteRenderbuffersEXT");
      glad_glGenRenderbuffersEXT = (PFNGLGENRENDERBUFFERSEXTPROC)(*load)("glGenRenderbuffersEXT");
      glad_glRenderbufferStorageEXT =
           (PFNGLRENDERBUFFERSTORAGEEXTPROC)(*load)("glRenderbufferStorageEXT");
      glad_glGetRenderbufferParameterivEXT =
           (PFNGLGETRENDERBUFFERPARAMETERIVEXTPROC)(*load)("glGetRenderbufferParameterivEXT");
      glad_glIsFramebufferEXT = (PFNGLISFRAMEBUFFEREXTPROC)(*load)("glIsFramebufferEXT");
      glad_glBindFramebufferEXT = (PFNGLBINDFRAMEBUFFEREXTPROC)(*load)("glBindFramebufferEXT");
      glad_glDeleteFramebuffersEXT =
           (PFNGLDELETEFRAMEBUFFERSEXTPROC)(*load)("glDeleteFramebuffersEXT");
      glad_glGenFramebuffersEXT = (PFNGLGENFRAMEBUFFERSEXTPROC)(*load)("glGenFramebuffersEXT");
      glad_glCheckFramebufferStatusEXT =
           (PFNGLCHECKFRAMEBUFFERSTATUSEXTPROC)(*load)("glCheckFramebufferStatusEXT");
      glad_glFramebufferTexture1DEXT =
           (PFNGLFRAMEBUFFERTEXTURE1DEXTPROC)(*load)("glFramebufferTexture1DEXT");
      glad_glFramebufferTexture2DEXT =
           (PFNGLFRAMEBUFFERTEXTURE2DEXTPROC)(*load)("glFramebufferTexture2DEXT");
      glad_glFramebufferTexture3DEXT =
           (PFNGLFRAMEBUFFERTEXTURE3DEXTPROC)(*load)("glFramebufferTexture3DEXT");
      glad_glFramebufferRenderbufferEXT =
           (PFNGLFRAMEBUFFERRENDERBUFFEREXTPROC)(*load)("glFramebufferRenderbufferEXT");
      glad_glGetFramebufferAttachmentParameterivEXT =
           (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVEXTPROC)
           (*load)("glGetFramebufferAttachmentParameterivEXT");
      glad_glGenerateMipmapEXT = (PFNGLGENERATEMIPMAPEXTPROC)(*load)("glGenerateMipmapEXT");
    }
    if (GLAD_GL_EXT_vertex_array != 0) {
      glad_glArrayElementEXT = (PFNGLARRAYELEMENTEXTPROC)(*load)("glArrayElementEXT");
      glad_glColorPointerEXT = (PFNGLCOLORPOINTEREXTPROC)(*load)("glColorPointerEXT");
      glad_glDrawArraysEXT = (PFNGLDRAWARRAYSEXTPROC)(*load)("glDrawArraysEXT");
      glad_glEdgeFlagPointerEXT = (PFNGLEDGEFLAGPOINTEREXTPROC)(*load)("glEdgeFlagPointerEXT");
      glad_glGetPointervEXT = (PFNGLGETPOINTERVEXTPROC)(*load)("glGetPointervEXT");
      glad_glIndexPointerEXT = (PFNGLINDEXPOINTEREXTPROC)(*load)("glIndexPointerEXT");
      glad_glNormalPointerEXT = (PFNGLNORMALPOINTEREXTPROC)(*load)("glNormalPointerEXT");
      glad_glTexCoordPointerEXT = (PFNGLTEXCOORDPOINTEREXTPROC)(*load)("glTexCoordPointerEXT");
      glad_glVertexPointerEXT = (PFNGLVERTEXPOINTEREXTPROC)(*load)("glVertexPointerEXT");
    }
    if (GLAD_GL_EXT_vertex_shader != 0) {
      glad_glBeginVertexShaderEXT = (PFNGLBEGINVERTEXSHADEREXTPROC)(*load)("glBeginVertexShaderEXT")
      ;
      glad_glEndVertexShaderEXT = (PFNGLENDVERTEXSHADEREXTPROC)(*load)("glEndVertexShaderEXT");
      glad_glBindVertexShaderEXT = (PFNGLBINDVERTEXSHADEREXTPROC)(*load)("glBindVertexShaderEXT");
      glad_glGenVertexShadersEXT = (PFNGLGENVERTEXSHADERSEXTPROC)(*load)("glGenVertexShadersEXT");
      glad_glDeleteVertexShaderEXT =
           (PFNGLDELETEVERTEXSHADEREXTPROC)(*load)("glDeleteVertexShaderEXT");
      glad_glShaderOp1EXT = (PFNGLSHADEROP1EXTPROC)(*load)("glShaderOp1EXT");
      glad_glShaderOp2EXT = (PFNGLSHADEROP2EXTPROC)(*load)("glShaderOp2EXT");
      glad_glShaderOp3EXT = (PFNGLSHADEROP3EXTPROC)(*load)("glShaderOp3EXT");
      glad_glSwizzleEXT = (PFNGLSWIZZLEEXTPROC)(*load)("glSwizzleEXT");
      glad_glWriteMaskEXT = (PFNGLWRITEMASKEXTPROC)(*load)("glWriteMaskEXT");
      glad_glInsertComponentEXT = (PFNGLINSERTCOMPONENTEXTPROC)(*load)("glInsertComponentEXT");
      glad_glExtractComponentEXT = (PFNGLEXTRACTCOMPONENTEXTPROC)(*load)("glExtractComponentEXT");
      glad_glGenSymbolsEXT = (PFNGLGENSYMBOLSEXTPROC)(*load)("glGenSymbolsEXT");
      glad_glSetInvariantEXT = (PFNGLSETINVARIANTEXTPROC)(*load)("glSetInvariantEXT");
      glad_glSetLocalConstantEXT = (PFNGLSETLOCALCONSTANTEXTPROC)(*load)("glSetLocalConstantEXT");
      glad_glVariantbvEXT = (PFNGLVARIANTBVEXTPROC)(*load)("glVariantbvEXT");
      glad_glVariantsvEXT = (PFNGLVARIANTSVEXTPROC)(*load)("glVariantsvEXT");
      glad_glVariantivEXT = (PFNGLVARIANTIVEXTPROC)(*load)("glVariantivEXT");
      glad_glVariantfvEXT = (PFNGLVARIANTFVEXTPROC)(*load)("glVariantfvEXT");
      glad_glVariantdvEXT = (PFNGLVARIANTDVEXTPROC)(*load)("glVariantdvEXT");
      glad_glVariantubvEXT = (PFNGLVARIANTUBVEXTPROC)(*load)("glVariantubvEXT");
      glad_glVariantusvEXT = (PFNGLVARIANTUSVEXTPROC)(*load)("glVariantusvEXT");
      glad_glVariantuivEXT = (PFNGLVARIANTUIVEXTPROC)(*load)("glVariantuivEXT");
      glad_glVariantPointerEXT = (PFNGLVARIANTPOINTEREXTPROC)(*load)("glVariantPointerEXT");
      glad_glEnableVariantClientStateEXT =
           (PFNGLENABLEVARIANTCLIENTSTATEEXTPROC)(*load)("glEnableVariantClientStateEXT");
      glad_glDisableVariantClientStateEXT =
           (PFNGLDISABLEVARIANTCLIENTSTATEEXTPROC)(*load)("glDisableVariantClientStateEXT");
      glad_glBindLightParameterEXT =
           (PFNGLBINDLIGHTPARAMETEREXTPROC)(*load)("glBindLightParameterEXT");
      glad_glBindMaterialParameterEXT =
           (PFNGLBINDMATERIALPARAMETEREXTPROC)(*load)("glBindMaterialParameterEXT");
      glad_glBindTexGenParameterEXT =
           (PFNGLBINDTEXGENPARAMETEREXTPROC)(*load)("glBindTexGenParameterEXT");
      glad_glBindTextureUnitParameterEXT =
           (PFNGLBINDTEXTUREUNITPARAMETEREXTPROC)(*load)("glBindTextureUnitParameterEXT");
      glad_glBindParameterEXT = (PFNGLBINDPARAMETEREXTPROC)(*load)("glBindParameterEXT");
      glad_glIsVariantEnabledEXT = (PFNGLISVARIANTENABLEDEXTPROC)(*load)("glIsVariantEnabledEXT");
      glad_glGetVariantBooleanvEXT =
           (PFNGLGETVARIANTBOOLEANVEXTPROC)(*load)("glGetVariantBooleanvEXT");
      glad_glGetVariantIntegervEXT =
           (PFNGLGETVARIANTINTEGERVEXTPROC)(*load)("glGetVariantIntegervEXT");
      glad_glGetVariantFloatvEXT = (PFNGLGETVARIANTFLOATVEXTPROC)(*load)("glGetVariantFloatvEXT");
      glad_glGetVariantPointervEXT =
           (PFNGLGETVARIANTPOINTERVEXTPROC)(*load)("glGetVariantPointervEXT");
      glad_glGetInvariantBooleanvEXT =
           (PFNGLGETINVARIANTBOOLEANVEXTPROC)(*load)("glGetInvariantBooleanvEXT");
      glad_glGetInvariantIntegervEXT =
           (PFNGLGETINVARIANTINTEGERVEXTPROC)(*load)("glGetInvariantIntegervEXT");
      glad_glGetInvariantFloatvEXT =
           (PFNGLGETINVARIANTFLOATVEXTPROC)(*load)("glGetInvariantFloatvEXT");
      glad_glGetLocalConstantBooleanvEXT =
           (PFNGLGETLOCALCONSTANTBOOLEANVEXTPROC)(*load)("glGetLocalConstantBooleanvEXT");
      glad_glGetLocalConstantIntegervEXT =
           (PFNGLGETLOCALCONSTANTINTEGERVEXTPROC)(*load)("glGetLocalConstantIntegervEXT");
      glad_glGetLocalConstantFloatvEXT =
           (PFNGLGETLOCALCONSTANTFLOATVEXTPROC)(*load)("glGetLocalConstantFloatvEXT");
    }
    uVar3 = (uint)(GLVersion.minor != 0 || GLVersion.major != 0);
  }
  return uVar3;
}

Assistant:

int gladLoadGLLoader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return 0;
	if(glGetString(GL_VERSION) == NULL) return 0;
	find_coreGL();
	load_GL_VERSION_1_0(load);
	load_GL_VERSION_1_1(load);
	load_GL_VERSION_1_2(load);
	load_GL_VERSION_1_3(load);
	load_GL_VERSION_1_4(load);
	load_GL_VERSION_1_5(load);
	load_GL_VERSION_2_0(load);
	load_GL_VERSION_2_1(load);
	load_GL_VERSION_3_0(load);
	load_GL_VERSION_3_1(load);
	load_GL_VERSION_3_2(load);
	load_GL_VERSION_3_3(load);

	if (!find_extensionsGL()) return 0;
	load_GL_AMD_debug_output(load);
	load_GL_ARB_ES2_compatibility(load);
	load_GL_ARB_buffer_storage(load);
	load_GL_ARB_debug_output(load);
	load_GL_ARB_draw_buffers(load);
	load_GL_ARB_draw_buffers_blend(load);
	load_GL_ARB_fragment_program(load);
	load_GL_ARB_framebuffer_object(load);
	load_GL_ARB_multisample(load);
	load_GL_ARB_sample_locations(load);
	load_GL_ARB_texture_compression(load);
	load_GL_ARB_texture_multisample(load);
	load_GL_ARB_uniform_buffer_object(load);
	load_GL_ARB_vertex_array_object(load);
	load_GL_ARB_vertex_attrib_binding(load);
	load_GL_ARB_vertex_buffer_object(load);
	load_GL_ARB_vertex_program(load);
	load_GL_ARB_vertex_shader(load);
	load_GL_ATI_element_array(load);
	load_GL_ATI_fragment_shader(load);
	load_GL_ATI_vertex_array_object(load);
	load_GL_EXT_blend_color(load);
	load_GL_EXT_blend_equation_separate(load);
	load_GL_EXT_blend_func_separate(load);
	load_GL_EXT_debug_marker(load);
	load_GL_EXT_framebuffer_blit(load);
	load_GL_EXT_framebuffer_multisample(load);
	load_GL_EXT_framebuffer_object(load);
	load_GL_EXT_vertex_array(load);
	load_GL_EXT_vertex_shader(load);
	return GLVersion.major != 0 || GLVersion.minor != 0;
}